

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bnll_x86_fma.cpp
# Opt level: O0

int __thiscall
ncnn::BNLL_x86_fma::forward_inplace(BNLL_x86_fma *this,Mat *bottom_top_blob,Option *opt)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [16];
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [16];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  long *in_RSI;
  double dVar120;
  float fVar125;
  float fVar126;
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  float fVar127;
  float fVar128;
  float fVar129;
  __m128 _x_1;
  __m128 _tmp_1;
  __m128 _abs_p_1;
  __m128 mask_3;
  __m128 _p_1;
  __m128 _zero;
  __m128 _one;
  __m256 _x;
  __m256 _tmp;
  __m256 _abs_p;
  __m256 mask;
  __m256 _p;
  __m256 _zero_avx;
  __m256 _one_avx;
  int i;
  float *ptr;
  int q;
  int size;
  int elempack;
  int channels;
  int d;
  int h;
  int w;
  Mat *m;
  __m256 y_1;
  __m256 z;
  __m256 tmp_1;
  __m256 mask_2;
  __m256 e;
  __m256 invalid_mask;
  __m256 one_1;
  __m256i imm0_1;
  __m256 pow2n;
  __m256 y;
  __m256 mask_1;
  __m256 one;
  __m256i imm0;
  __m256 fx;
  __m256 tmp;
  v4sf y_3;
  v4sf z_1;
  v4sf tmp_3;
  v4sf mask_5;
  v4sf e_1;
  v4sf invalid_mask_1;
  v4sf one_3;
  v4si emm0_1;
  v4sf pow2n_1;
  v4sf y_2;
  v4sf mask_4;
  v4sf one_2;
  v4si emm0;
  v4sf fx_1;
  v4sf tmp_2;
  imm_xmm_union u_6;
  imm_xmm_union u_5;
  __m256i ret_2;
  __m128i x2_2;
  __m128i x1_2;
  imm_xmm_union u_9;
  imm_xmm_union u_8;
  imm_xmm_union u_7;
  __m256i ret_3;
  __m128i y2_1;
  __m128i y1_1;
  __m128i x2_3;
  __m128i x1_3;
  imm_xmm_union u_2;
  imm_xmm_union u_1;
  imm_xmm_union u;
  __m256i ret;
  __m128i y2;
  __m128i y1;
  __m128i x2;
  __m128i x1;
  imm_xmm_union u_4;
  imm_xmm_union u_3;
  __m256i ret_1;
  __m128i x2_1;
  __m128i x1_1;
  undefined8 local_2e50;
  undefined8 uStack_2e48;
  undefined8 local_2e30;
  undefined8 uStack_2e28;
  undefined8 local_2e20;
  undefined8 uStack_2e18;
  undefined8 local_2e10;
  undefined8 uStack_2e08;
  undefined8 local_2de0;
  undefined8 uStack_2dd8;
  undefined8 uStack_2dd0;
  undefined8 uStack_2dc8;
  undefined8 local_2da0;
  undefined8 uStack_2d98;
  undefined8 uStack_2d90;
  undefined8 uStack_2d88;
  undefined8 local_2d80;
  undefined8 uStack_2d78;
  undefined8 uStack_2d70;
  undefined8 uStack_2d68;
  undefined4 uStack_2d54;
  undefined4 uStack_2d50;
  undefined4 uStack_2d4c;
  undefined4 uStack_2d48;
  undefined4 uStack_2d44;
  int local_2cf8;
  undefined8 local_2ce8;
  undefined8 local_2ce0;
  undefined8 local_2cd8;
  undefined4 local_2cd0;
  long local_2cc8;
  undefined4 local_2cc0;
  undefined4 local_2cbc;
  undefined4 local_2cb8;
  undefined4 local_2cb4;
  undefined4 local_2cb0;
  undefined8 local_2ca8;
  undefined1 (*local_2ca0) [32];
  int local_2c94;
  int local_2c90;
  int local_2c8c;
  int local_2c88;
  int local_2c84;
  int local_2c80;
  int local_2c7c;
  long *local_2c70;
  undefined1 local_2c5d;
  int local_2c5c;
  undefined8 *local_2c50;
  undefined8 *local_2c48;
  undefined8 *local_2c38;
  undefined4 local_2c24;
  undefined1 local_2c20 [32];
  undefined1 local_2c00 [32];
  undefined1 (*local_2bc8) [32];
  undefined8 local_2bc0;
  undefined8 uStack_2bb8;
  undefined8 uStack_2bb0;
  undefined8 uStack_2ba8;
  undefined8 local_2ba0;
  undefined8 uStack_2b98;
  undefined8 uStack_2b90;
  undefined8 uStack_2b88;
  int local_2b80 [2];
  int aiStack_2b78 [2];
  int aiStack_2b70 [2];
  int aiStack_2b68 [2];
  undefined8 local_2b60;
  undefined8 uStack_2b58;
  undefined8 uStack_2b50;
  undefined8 uStack_2b48;
  undefined1 local_2b40 [8];
  undefined8 uStack_2b38;
  undefined8 uStack_2b30;
  ulong uStack_2b28;
  float local_2b20;
  float fStack_2b1c;
  float fStack_2b18;
  float fStack_2b14;
  float fStack_2b10;
  float fStack_2b0c;
  float fStack_2b08;
  float fStack_2b04;
  undefined1 local_2b00 [32];
  undefined1 local_2ae0 [32];
  undefined1 local_2ac0 [8];
  undefined8 uStack_2ab8;
  undefined8 uStack_2ab0;
  undefined8 uStack_2aa8;
  undefined1 local_2aa0 [32];
  undefined8 local_2a80;
  undefined8 uStack_2a78;
  undefined8 uStack_2a70;
  undefined8 uStack_2a68;
  undefined8 local_2a60;
  undefined8 uStack_2a58;
  undefined8 uStack_2a50;
  undefined8 uStack_2a48;
  undefined1 local_2a40 [8];
  undefined8 uStack_2a38;
  undefined8 uStack_2a30;
  undefined8 uStack_2a28;
  undefined1 local_2a20 [32];
  undefined8 local_2a00;
  undefined8 uStack_29f8;
  undefined8 uStack_29f0;
  undefined8 uStack_29e8;
  undefined8 local_29e0;
  undefined8 uStack_29d8;
  undefined8 uStack_29d0;
  undefined8 uStack_29c8;
  undefined8 local_29c0;
  undefined8 uStack_29b8;
  undefined8 uStack_29b0;
  undefined8 uStack_29a8;
  undefined8 local_29a0;
  undefined8 uStack_2998;
  undefined8 uStack_2990;
  undefined8 uStack_2988;
  undefined8 local_2980;
  undefined8 uStack_2978;
  undefined8 uStack_2970;
  undefined8 uStack_2968;
  undefined8 local_2960;
  undefined8 uStack_2958;
  undefined8 uStack_2950;
  undefined8 uStack_2948;
  undefined8 local_2940;
  undefined8 uStack_2938;
  undefined8 uStack_2930;
  undefined8 uStack_2928;
  undefined8 local_2920;
  undefined8 uStack_2918;
  undefined8 uStack_2910;
  undefined8 uStack_2908;
  undefined8 local_2900;
  undefined8 uStack_28f8;
  undefined8 uStack_28f0;
  undefined8 uStack_28e8;
  undefined8 local_28e0;
  undefined8 uStack_28d8;
  undefined8 uStack_28d0;
  undefined8 uStack_28c8;
  undefined8 local_28c0;
  undefined8 uStack_28b8;
  undefined8 uStack_28b0;
  undefined8 uStack_28a8;
  undefined8 local_28a0;
  undefined8 uStack_2898;
  undefined8 uStack_2890;
  undefined8 uStack_2888;
  undefined8 local_2880;
  undefined8 uStack_2878;
  undefined8 uStack_2870;
  undefined8 uStack_2868;
  undefined8 local_2860;
  undefined8 uStack_2858;
  undefined8 uStack_2850;
  undefined8 uStack_2848;
  undefined8 local_2840;
  undefined8 uStack_2838;
  undefined8 uStack_2830;
  undefined8 uStack_2828;
  undefined8 local_2820;
  undefined8 uStack_2818;
  undefined8 uStack_2810;
  undefined8 uStack_2808;
  undefined8 local_2800;
  undefined8 uStack_27f8;
  undefined8 uStack_27f0;
  undefined8 uStack_27e8;
  undefined1 local_27e0 [8];
  undefined8 uStack_27d8;
  undefined8 uStack_27d0;
  undefined8 uStack_27c8;
  undefined1 local_27c0 [32];
  undefined8 local_27a0;
  undefined8 uStack_2798;
  undefined8 uStack_2790;
  undefined8 uStack_2788;
  undefined8 local_2780;
  undefined8 uStack_2778;
  undefined8 uStack_2770;
  undefined8 uStack_2768;
  undefined1 local_2760 [32];
  undefined1 local_2740 [8];
  undefined8 uStack_2738;
  undefined8 uStack_2730;
  undefined8 uStack_2728;
  undefined1 local_2720 [32];
  undefined1 local_2700 [32];
  undefined8 local_26e0;
  undefined8 uStack_26d8;
  undefined8 uStack_26d0;
  undefined8 uStack_26c8;
  undefined8 local_26c0;
  undefined8 uStack_26b8;
  undefined8 uStack_26b0;
  undefined8 uStack_26a8;
  undefined8 local_26a0;
  undefined8 uStack_2698;
  undefined8 uStack_2690;
  undefined8 uStack_2688;
  undefined8 local_2680;
  undefined8 uStack_2678;
  undefined8 uStack_2670;
  undefined8 uStack_2668;
  undefined8 local_2660;
  undefined8 uStack_2658;
  undefined8 uStack_2650;
  undefined8 uStack_2648;
  undefined8 local_2640;
  undefined8 uStack_2638;
  undefined8 uStack_2630;
  undefined8 uStack_2628;
  undefined1 local_2620 [32];
  undefined8 local_2600;
  undefined8 uStack_25f8;
  undefined8 uStack_25f0;
  undefined8 uStack_25e8;
  undefined8 local_25e0;
  undefined8 uStack_25d8;
  undefined8 uStack_25d0;
  undefined8 uStack_25c8;
  undefined8 local_25c0;
  undefined8 uStack_25b8;
  undefined8 uStack_25b0;
  undefined8 uStack_25a8;
  undefined8 local_25a0;
  undefined8 uStack_2598;
  undefined8 uStack_2590;
  undefined8 uStack_2588;
  undefined8 local_2580;
  ulong uStack_2578;
  undefined8 uStack_2570;
  undefined8 uStack_2568;
  undefined8 local_2560;
  undefined8 uStack_2558;
  undefined8 uStack_2550;
  undefined8 uStack_2548;
  undefined1 (*local_2528) [32];
  undefined4 local_2520;
  undefined4 uStack_251c;
  undefined4 uStack_2518;
  undefined4 uStack_2514;
  undefined4 local_2504;
  undefined1 local_2500 [16];
  undefined1 (*local_24e8) [32];
  undefined8 local_24e0;
  ulong uStack_24d8;
  undefined8 local_24d0;
  undefined8 uStack_24c8;
  undefined8 local_24c0;
  undefined8 uStack_24b8;
  undefined8 local_24b0;
  undefined8 uStack_24a8;
  int local_24a0 [2];
  int aiStack_2498 [2];
  undefined8 local_2490;
  undefined8 uStack_2488;
  undefined1 local_2480 [8];
  undefined8 uStack_2478;
  float local_2470;
  float fStack_246c;
  float fStack_2468;
  float fStack_2464;
  undefined1 local_2460 [16];
  undefined1 local_2450 [16];
  undefined1 local_2440 [8];
  undefined8 uStack_2438;
  undefined1 local_2430 [16];
  undefined8 local_2420;
  undefined8 uStack_2418;
  undefined1 local_2410 [16];
  undefined1 local_2400 [8];
  undefined8 uStack_23f8;
  undefined8 local_23f0;
  undefined8 uStack_23e8;
  undefined8 local_23e0;
  undefined8 uStack_23d8;
  undefined8 local_23d0;
  undefined8 uStack_23c8;
  undefined8 local_23c0;
  undefined8 uStack_23b8;
  undefined8 local_23b0;
  undefined8 uStack_23a8;
  undefined8 local_23a0;
  undefined8 uStack_2398;
  undefined8 local_2390;
  undefined8 uStack_2388;
  undefined8 local_2380;
  undefined8 uStack_2378;
  undefined8 local_2370;
  undefined8 uStack_2368;
  undefined8 local_2360;
  undefined8 uStack_2358;
  undefined8 local_2350;
  undefined8 uStack_2348;
  undefined8 local_2340;
  undefined8 uStack_2338;
  undefined8 local_2330;
  undefined8 uStack_2328;
  undefined8 local_2320;
  undefined8 uStack_2318;
  undefined8 local_2310;
  undefined8 uStack_2308;
  undefined8 local_2300;
  undefined8 uStack_22f8;
  undefined8 local_22f0;
  undefined8 uStack_22e8;
  undefined8 local_22e0;
  undefined8 uStack_22d8;
  undefined8 local_22d0;
  undefined8 uStack_22c8;
  undefined1 local_22c0 [16];
  undefined8 local_22b0;
  undefined8 uStack_22a8;
  undefined1 local_22a0 [16];
  undefined1 local_2290 [8];
  undefined8 uStack_2288;
  undefined8 local_2280;
  undefined8 uStack_2278;
  undefined1 local_2270 [16];
  undefined8 local_2260;
  undefined8 uStack_2258;
  undefined8 local_2250;
  undefined8 uStack_2248;
  undefined8 local_2240;
  undefined8 uStack_2238;
  undefined8 local_2230;
  undefined8 uStack_2228;
  undefined8 local_2220;
  undefined8 uStack_2218;
  undefined8 local_2210;
  undefined8 uStack_2208;
  undefined8 local_2200;
  undefined8 uStack_21f8;
  undefined8 local_21f0;
  undefined8 uStack_21e8;
  undefined8 local_21e0;
  undefined8 uStack_21d8;
  undefined8 local_21d0;
  undefined8 uStack_21c8;
  undefined8 local_21c0;
  undefined8 uStack_21b8;
  undefined1 local_21b0 [16];
  undefined8 local_21a0;
  undefined8 uStack_2198;
  undefined8 local_2190;
  undefined8 uStack_2188;
  undefined8 local_2180;
  undefined8 uStack_2178;
  undefined8 local_2170;
  undefined8 uStack_2168;
  undefined8 local_2160;
  ulong uStack_2158;
  undefined8 local_2150;
  undefined8 uStack_2148;
  undefined1 (*local_2138) [32];
  long local_2130;
  undefined4 local_2124;
  long local_2120;
  undefined1 (*local_2118) [32];
  undefined4 local_210c;
  int local_2108;
  int local_2104;
  undefined8 *local_2100;
  undefined4 local_20f4;
  long local_20f0;
  undefined8 *local_20d0;
  undefined1 local_20a0 [16];
  undefined1 auStack_2090 [16];
  undefined4 local_2080;
  undefined4 local_207c;
  undefined4 local_2078;
  undefined4 local_2074;
  undefined4 local_2070;
  undefined4 local_206c;
  undefined4 local_2068;
  undefined4 local_2064;
  undefined8 local_2060;
  undefined8 uStack_2058;
  undefined8 uStack_2050;
  undefined8 uStack_2048;
  undefined8 local_2040;
  undefined8 uStack_2038;
  undefined8 uStack_2030;
  undefined8 uStack_2028;
  undefined8 local_2020;
  undefined8 uStack_2018;
  undefined8 uStack_2010;
  undefined8 uStack_2008;
  undefined8 local_2000;
  undefined8 uStack_1ff8;
  undefined8 uStack_1ff0;
  undefined8 uStack_1fe8;
  undefined8 local_1fe0;
  undefined8 uStack_1fd8;
  undefined8 uStack_1fd0;
  undefined8 uStack_1fc8;
  undefined8 local_1fc0;
  undefined8 uStack_1fb8;
  undefined8 uStack_1fb0;
  undefined8 uStack_1fa8;
  undefined8 local_1fa0;
  undefined8 uStack_1f98;
  undefined8 uStack_1f90;
  undefined8 uStack_1f88;
  undefined1 local_1f70 [16];
  undefined1 local_1f60 [16];
  undefined4 local_1f44;
  undefined8 local_1f40;
  undefined8 uStack_1f38;
  undefined8 uStack_1f30;
  undefined8 uStack_1f28;
  undefined8 local_1f20;
  undefined8 uStack_1f18;
  undefined8 uStack_1f10;
  undefined8 uStack_1f08;
  undefined8 local_1f00;
  undefined8 uStack_1ef8;
  undefined8 uStack_1ef0;
  undefined8 uStack_1ee8;
  undefined8 local_1ee0;
  undefined8 uStack_1ed8;
  undefined8 uStack_1ed0;
  undefined8 uStack_1ec8;
  undefined8 local_1ec0;
  undefined8 uStack_1eb8;
  undefined8 uStack_1eb0;
  undefined8 uStack_1ea8;
  undefined8 local_1ea0;
  undefined8 uStack_1e98;
  undefined8 uStack_1e90;
  undefined8 uStack_1e88;
  undefined8 local_1e80;
  undefined8 uStack_1e78;
  undefined8 uStack_1e70;
  undefined8 uStack_1e68;
  undefined8 local_1e60;
  undefined8 uStack_1e58;
  undefined8 uStack_1e50;
  undefined8 uStack_1e48;
  undefined8 local_1e40;
  undefined8 uStack_1e38;
  undefined8 uStack_1e30;
  undefined8 uStack_1e28;
  undefined8 local_1e20;
  undefined8 uStack_1e18;
  undefined8 uStack_1e10;
  undefined8 uStack_1e08;
  undefined8 local_1e00;
  undefined8 uStack_1df8;
  undefined8 local_1df0;
  undefined8 uStack_1de8;
  undefined1 local_1de0 [16];
  undefined1 local_1dd0 [16];
  undefined8 local_1dc0;
  undefined8 uStack_1db8;
  undefined8 uStack_1db0;
  undefined8 uStack_1da8;
  undefined8 local_1da0;
  undefined8 uStack_1d98;
  undefined8 uStack_1d90;
  undefined8 uStack_1d88;
  undefined8 local_1d80;
  undefined8 uStack_1d78;
  undefined8 uStack_1d70;
  undefined8 uStack_1d68;
  undefined8 local_1d60;
  undefined8 uStack_1d58;
  undefined8 uStack_1d50;
  undefined8 uStack_1d48;
  undefined8 local_1d40;
  undefined8 uStack_1d38;
  undefined8 uStack_1d30;
  undefined8 uStack_1d28;
  undefined8 local_1d20;
  undefined8 uStack_1d18;
  undefined8 uStack_1d10;
  undefined8 uStack_1d08;
  undefined8 local_1d00;
  undefined8 uStack_1cf8;
  undefined8 uStack_1cf0;
  undefined8 uStack_1ce8;
  undefined8 local_1ce0;
  undefined8 uStack_1cd8;
  undefined8 uStack_1cd0;
  undefined8 uStack_1cc8;
  undefined8 local_1cc0;
  undefined8 uStack_1cb8;
  undefined8 uStack_1cb0;
  ulong uStack_1ca8;
  undefined8 local_1ca0;
  undefined8 uStack_1c98;
  undefined8 uStack_1c90;
  undefined8 uStack_1c88;
  undefined8 local_1c80;
  undefined8 uStack_1c78;
  undefined8 uStack_1c70;
  undefined8 uStack_1c68;
  undefined8 local_1c60;
  undefined8 uStack_1c58;
  undefined8 uStack_1c50;
  undefined8 uStack_1c48;
  undefined8 local_1c40;
  undefined8 uStack_1c38;
  undefined8 uStack_1c30;
  undefined8 uStack_1c28;
  undefined8 local_1c20;
  undefined8 uStack_1c18;
  undefined8 uStack_1c10;
  undefined8 uStack_1c08;
  undefined8 local_1c00;
  undefined8 uStack_1bf8;
  undefined8 uStack_1bf0;
  undefined8 uStack_1be8;
  undefined8 local_1be0;
  undefined8 uStack_1bd8;
  undefined8 uStack_1bd0;
  undefined8 uStack_1bc8;
  undefined8 local_1bc0;
  undefined8 uStack_1bb8;
  undefined8 uStack_1bb0;
  undefined8 uStack_1ba8;
  undefined8 local_1ba0;
  undefined8 uStack_1b98;
  undefined8 uStack_1b90;
  undefined8 uStack_1b88;
  undefined8 local_1b80;
  undefined8 uStack_1b78;
  undefined8 uStack_1b70;
  undefined8 uStack_1b68;
  undefined8 local_1b60;
  undefined8 uStack_1b58;
  undefined8 uStack_1b50;
  undefined8 uStack_1b48;
  undefined8 local_1b40;
  undefined8 uStack_1b38;
  undefined8 uStack_1b30;
  undefined8 uStack_1b28;
  undefined8 local_1b20;
  undefined8 uStack_1b18;
  undefined8 uStack_1b10;
  undefined8 uStack_1b08;
  undefined8 local_1b00;
  undefined8 uStack_1af8;
  undefined8 uStack_1af0;
  undefined8 uStack_1ae8;
  undefined8 local_1ae0;
  undefined8 uStack_1ad8;
  undefined8 uStack_1ad0;
  undefined8 uStack_1ac8;
  undefined8 local_1ac0;
  undefined8 uStack_1ab8;
  undefined8 uStack_1ab0;
  undefined8 uStack_1aa8;
  undefined8 local_1aa0;
  undefined8 uStack_1a98;
  undefined8 uStack_1a90;
  undefined8 uStack_1a88;
  undefined8 local_1a80;
  undefined8 uStack_1a78;
  undefined8 uStack_1a70;
  undefined8 uStack_1a68;
  undefined8 local_1a60;
  undefined8 uStack_1a58;
  undefined8 uStack_1a50;
  undefined8 uStack_1a48;
  undefined8 local_1a40;
  undefined8 uStack_1a38;
  undefined8 uStack_1a30;
  undefined8 uStack_1a28;
  undefined8 local_1a20;
  undefined8 uStack_1a18;
  undefined8 uStack_1a10;
  undefined8 uStack_1a08;
  undefined8 local_1a00;
  undefined8 uStack_19f8;
  undefined8 uStack_19f0;
  undefined8 uStack_19e8;
  undefined8 local_19e0;
  undefined8 uStack_19d8;
  undefined8 uStack_19d0;
  undefined8 uStack_19c8;
  undefined8 local_19c0;
  undefined8 uStack_19b8;
  undefined8 uStack_19b0;
  undefined8 uStack_19a8;
  undefined8 local_19a0;
  undefined8 uStack_1998;
  undefined8 uStack_1990;
  undefined8 uStack_1988;
  undefined8 local_1980;
  undefined8 uStack_1978;
  undefined8 uStack_1970;
  undefined8 uStack_1968;
  undefined8 local_1960;
  undefined8 uStack_1958;
  undefined8 uStack_1950;
  undefined8 uStack_1948;
  undefined8 local_1940;
  undefined8 uStack_1938;
  undefined8 uStack_1930;
  undefined8 uStack_1928;
  undefined8 local_1920;
  undefined8 uStack_1918;
  undefined8 uStack_1910;
  ulong uStack_1908;
  undefined8 local_1900;
  undefined8 uStack_18f8;
  undefined8 uStack_18f0;
  undefined8 uStack_18e8;
  undefined8 local_18e0;
  undefined8 uStack_18d8;
  undefined8 uStack_18d0;
  undefined8 uStack_18c8;
  undefined8 local_18c0;
  undefined8 uStack_18b8;
  undefined8 uStack_18b0;
  undefined8 uStack_18a8;
  undefined8 local_18a0;
  undefined8 uStack_1898;
  undefined8 uStack_1890;
  undefined8 uStack_1888;
  undefined8 local_1880;
  undefined8 uStack_1878;
  undefined8 uStack_1870;
  undefined8 uStack_1868;
  undefined8 local_1860;
  undefined8 uStack_1858;
  undefined8 uStack_1850;
  undefined8 uStack_1848;
  undefined8 local_1840;
  undefined8 uStack_1838;
  undefined8 uStack_1830;
  undefined8 uStack_1828;
  undefined8 local_1820;
  undefined8 uStack_1818;
  undefined8 uStack_1810;
  undefined8 uStack_1808;
  undefined8 local_1800;
  undefined8 uStack_17f8;
  undefined8 uStack_17f0;
  undefined8 uStack_17e8;
  undefined8 local_17e0;
  undefined8 uStack_17d8;
  undefined8 uStack_17d0;
  undefined8 uStack_17c8;
  undefined8 local_17c0;
  undefined8 uStack_17b8;
  undefined8 uStack_17b0;
  undefined8 uStack_17a8;
  undefined8 local_17a0;
  undefined8 uStack_1798;
  undefined8 uStack_1790;
  undefined8 uStack_1788;
  undefined8 local_1780;
  undefined8 uStack_1778;
  undefined8 uStack_1770;
  undefined8 uStack_1768;
  undefined8 local_1760;
  undefined8 uStack_1758;
  undefined8 uStack_1750;
  undefined8 uStack_1748;
  undefined8 local_1740;
  undefined8 uStack_1738;
  undefined8 uStack_1730;
  undefined8 uStack_1728;
  undefined8 local_1720;
  undefined8 uStack_1718;
  undefined8 uStack_1710;
  undefined8 uStack_1708;
  undefined8 local_1700;
  undefined8 uStack_16f8;
  undefined8 uStack_16f0;
  undefined8 uStack_16e8;
  undefined8 local_16e0;
  undefined8 uStack_16d8;
  undefined8 uStack_16d0;
  undefined8 uStack_16c8;
  undefined8 local_16c0;
  undefined8 uStack_16b8;
  undefined8 uStack_16b0;
  undefined8 uStack_16a8;
  undefined8 local_16a0;
  undefined8 uStack_1698;
  undefined8 uStack_1690;
  undefined8 uStack_1688;
  undefined8 local_1680;
  undefined8 uStack_1678;
  undefined8 uStack_1670;
  undefined8 uStack_1668;
  undefined8 local_1660;
  undefined8 uStack_1658;
  undefined8 uStack_1650;
  undefined8 uStack_1648;
  undefined8 local_1640;
  undefined8 uStack_1638;
  undefined8 uStack_1630;
  undefined8 uStack_1628;
  undefined8 local_1620;
  undefined8 uStack_1618;
  undefined8 uStack_1610;
  undefined8 uStack_1608;
  undefined8 local_1600;
  undefined8 uStack_15f8;
  undefined8 uStack_15f0;
  undefined8 uStack_15e8;
  undefined8 local_15e0;
  undefined8 uStack_15d8;
  undefined8 uStack_15d0;
  undefined8 uStack_15c8;
  undefined8 local_15c0;
  undefined8 uStack_15b8;
  undefined8 uStack_15b0;
  undefined8 uStack_15a8;
  undefined8 local_15a0;
  undefined8 uStack_1598;
  undefined8 uStack_1590;
  undefined8 uStack_1588;
  undefined8 local_1580;
  undefined8 uStack_1578;
  undefined8 uStack_1570;
  undefined8 uStack_1568;
  undefined8 local_1560;
  undefined8 uStack_1558;
  undefined8 uStack_1550;
  undefined8 uStack_1548;
  undefined8 local_1540;
  undefined8 uStack_1538;
  undefined8 uStack_1530;
  undefined8 uStack_1528;
  undefined8 local_1520;
  undefined8 uStack_1518;
  undefined8 uStack_1510;
  undefined8 uStack_1508;
  undefined8 local_1500;
  undefined8 uStack_14f8;
  undefined8 uStack_14f0;
  undefined8 uStack_14e8;
  undefined8 local_14e0;
  undefined8 uStack_14d8;
  undefined8 uStack_14d0;
  undefined8 uStack_14c8;
  undefined8 local_14c0;
  undefined8 uStack_14b8;
  undefined8 uStack_14b0;
  undefined8 uStack_14a8;
  undefined4 local_1494;
  undefined8 local_1490;
  undefined8 uStack_1488;
  undefined4 local_1474;
  undefined8 local_1470;
  undefined8 uStack_1468;
  undefined4 local_1454;
  undefined8 local_1450;
  undefined8 uStack_1448;
  undefined8 local_1440;
  undefined8 uStack_1438;
  undefined8 local_1430;
  undefined8 uStack_1428;
  undefined8 local_1420;
  undefined8 uStack_1418;
  undefined8 local_1410;
  undefined8 uStack_1408;
  undefined8 local_1400;
  undefined8 uStack_13f8;
  undefined8 local_13f0;
  undefined8 uStack_13e8;
  undefined8 local_13e0;
  undefined8 uStack_13d8;
  undefined8 uStack_13d0;
  undefined8 uStack_13c8;
  undefined8 local_13c0;
  undefined8 uStack_13b8;
  undefined8 uStack_13b0;
  undefined8 uStack_13a8;
  undefined8 local_13a0;
  undefined8 uStack_1398;
  undefined8 uStack_1390;
  undefined8 uStack_1388;
  undefined8 local_1380;
  undefined8 uStack_1378;
  undefined8 uStack_1370;
  undefined8 uStack_1368;
  undefined8 local_1360;
  undefined8 uStack_1358;
  undefined8 uStack_1350;
  undefined8 uStack_1348;
  undefined8 local_1340;
  undefined8 uStack_1338;
  undefined8 uStack_1330;
  undefined8 uStack_1328;
  undefined8 local_1320;
  undefined8 uStack_1318;
  undefined8 uStack_1310;
  undefined8 uStack_1308;
  undefined8 local_1300;
  undefined8 uStack_12f8;
  undefined8 uStack_12f0;
  undefined8 uStack_12e8;
  undefined8 local_12e0;
  undefined8 uStack_12d8;
  undefined8 uStack_12d0;
  undefined8 uStack_12c8;
  undefined8 local_12c0;
  undefined8 uStack_12b8;
  undefined8 uStack_12b0;
  undefined8 uStack_12a8;
  undefined8 local_12a0;
  undefined8 uStack_1298;
  undefined8 uStack_1290;
  undefined8 uStack_1288;
  undefined8 local_1280;
  undefined8 uStack_1278;
  undefined8 uStack_1270;
  undefined8 uStack_1268;
  undefined8 local_1260;
  undefined8 uStack_1258;
  undefined8 uStack_1250;
  undefined8 uStack_1248;
  undefined8 local_1240;
  undefined8 uStack_1238;
  undefined8 uStack_1230;
  undefined8 uStack_1228;
  undefined8 local_1220;
  undefined8 uStack_1218;
  undefined8 uStack_1210;
  undefined8 uStack_1208;
  undefined8 local_1200;
  undefined8 uStack_11f8;
  undefined8 uStack_11f0;
  undefined8 uStack_11e8;
  undefined8 local_11e0;
  undefined8 uStack_11d8;
  undefined8 uStack_11d0;
  undefined8 uStack_11c8;
  undefined8 local_11c0;
  undefined8 uStack_11b8;
  undefined8 uStack_11b0;
  undefined8 uStack_11a8;
  undefined8 local_11a0;
  undefined8 uStack_1198;
  undefined8 uStack_1190;
  undefined8 uStack_1188;
  undefined8 local_1180;
  undefined8 uStack_1178;
  undefined8 uStack_1170;
  undefined8 uStack_1168;
  undefined8 local_1160;
  undefined8 uStack_1158;
  undefined8 uStack_1150;
  undefined8 uStack_1148;
  undefined8 local_1140;
  undefined8 uStack_1138;
  undefined8 uStack_1130;
  undefined8 uStack_1128;
  undefined8 local_1120;
  undefined8 uStack_1118;
  undefined8 uStack_1110;
  undefined8 uStack_1108;
  undefined8 local_1100;
  undefined8 uStack_10f8;
  undefined8 uStack_10f0;
  undefined8 uStack_10e8;
  undefined8 local_10e0;
  undefined8 uStack_10d8;
  undefined8 uStack_10d0;
  ulong uStack_10c8;
  undefined8 local_10c0;
  undefined8 uStack_10b8;
  undefined8 uStack_10b0;
  undefined8 uStack_10a8;
  undefined8 local_10a0;
  undefined8 uStack_1098;
  undefined8 uStack_1090;
  undefined8 uStack_1088;
  undefined8 local_1080;
  undefined8 uStack_1078;
  undefined8 uStack_1070;
  undefined8 uStack_1068;
  undefined8 local_1060;
  undefined8 uStack_1058;
  undefined8 uStack_1050;
  undefined8 uStack_1048;
  undefined8 local_1040;
  undefined8 uStack_1038;
  undefined8 uStack_1030;
  undefined8 uStack_1028;
  undefined8 local_1020;
  undefined8 uStack_1018;
  undefined8 uStack_1010;
  undefined8 uStack_1008;
  undefined8 local_1000;
  undefined8 uStack_ff8;
  undefined8 uStack_ff0;
  undefined8 uStack_fe8;
  undefined8 local_fe0;
  undefined8 uStack_fd8;
  undefined8 uStack_fd0;
  undefined8 uStack_fc8;
  undefined8 local_fc0;
  undefined8 uStack_fb8;
  undefined8 uStack_fb0;
  undefined8 uStack_fa8;
  undefined8 local_fa0;
  undefined8 uStack_f98;
  undefined8 uStack_f90;
  undefined8 uStack_f88;
  undefined8 local_f80;
  undefined8 uStack_f78;
  undefined8 uStack_f70;
  undefined8 uStack_f68;
  undefined8 local_f60;
  undefined8 uStack_f58;
  undefined8 uStack_f50;
  undefined8 uStack_f48;
  undefined8 local_f40;
  undefined8 uStack_f38;
  undefined8 uStack_f30;
  undefined8 uStack_f28;
  undefined8 local_f20;
  undefined8 uStack_f18;
  undefined8 uStack_f10;
  undefined8 uStack_f08;
  undefined8 local_f00;
  undefined8 uStack_ef8;
  undefined8 uStack_ef0;
  undefined8 uStack_ee8;
  undefined8 local_ee0;
  undefined8 uStack_ed8;
  undefined8 uStack_ed0;
  undefined8 uStack_ec8;
  undefined8 local_ec0;
  undefined8 uStack_eb8;
  undefined8 uStack_eb0;
  undefined8 uStack_ea8;
  undefined8 local_ea0;
  undefined8 uStack_e98;
  undefined8 uStack_e90;
  undefined8 uStack_e88;
  undefined8 local_e80;
  undefined8 uStack_e78;
  undefined8 uStack_e70;
  undefined8 uStack_e68;
  undefined8 local_e60;
  undefined8 uStack_e58;
  undefined8 uStack_e50;
  undefined8 uStack_e48;
  undefined8 local_e40;
  undefined8 uStack_e38;
  undefined8 uStack_e30;
  undefined8 uStack_e28;
  undefined8 local_e20;
  undefined8 uStack_e18;
  undefined8 uStack_e10;
  undefined8 uStack_e08;
  undefined8 local_e00;
  undefined8 uStack_df8;
  undefined8 uStack_df0;
  undefined8 uStack_de8;
  undefined8 local_de0;
  undefined8 uStack_dd8;
  undefined8 uStack_dd0;
  undefined8 uStack_dc8;
  undefined8 local_dc0;
  undefined8 uStack_db8;
  undefined8 uStack_db0;
  undefined8 uStack_da8;
  undefined8 local_da0;
  undefined8 uStack_d98;
  undefined8 uStack_d90;
  undefined8 uStack_d88;
  undefined8 local_d80;
  undefined8 uStack_d78;
  undefined8 uStack_d70;
  undefined8 uStack_d68;
  undefined8 local_d60;
  undefined8 uStack_d58;
  undefined8 uStack_d50;
  undefined8 uStack_d48;
  undefined8 local_d40;
  undefined8 uStack_d38;
  undefined8 uStack_d30;
  undefined8 uStack_d28;
  undefined8 local_d20;
  undefined8 uStack_d18;
  undefined8 uStack_d10;
  undefined8 uStack_d08;
  undefined8 local_d00;
  undefined8 uStack_cf8;
  undefined8 uStack_cf0;
  undefined8 uStack_ce8;
  undefined8 local_ce0;
  undefined8 uStack_cd8;
  undefined8 uStack_cd0;
  undefined8 uStack_cc8;
  undefined8 local_cc0;
  undefined8 uStack_cb8;
  undefined8 uStack_cb0;
  undefined8 uStack_ca8;
  undefined8 local_ca0;
  undefined8 uStack_c98;
  undefined8 uStack_c90;
  undefined8 uStack_c88;
  undefined8 local_c80;
  undefined8 uStack_c78;
  undefined8 uStack_c70;
  undefined8 uStack_c68;
  undefined8 local_c60;
  undefined8 uStack_c58;
  undefined8 uStack_c50;
  undefined8 uStack_c48;
  undefined8 local_c40;
  undefined8 uStack_c38;
  undefined8 uStack_c30;
  undefined8 uStack_c28;
  undefined8 local_c20;
  undefined8 uStack_c18;
  undefined8 uStack_c10;
  undefined8 uStack_c08;
  undefined8 local_c00;
  undefined8 uStack_bf8;
  undefined8 uStack_bf0;
  undefined8 uStack_be8;
  undefined8 local_be0;
  undefined8 uStack_bd8;
  undefined8 uStack_bd0;
  undefined8 uStack_bc8;
  undefined8 local_bc0;
  undefined8 uStack_bb8;
  undefined8 uStack_bb0;
  undefined8 uStack_ba8;
  undefined8 local_ba0;
  undefined8 uStack_b98;
  undefined8 uStack_b90;
  undefined8 uStack_b88;
  undefined8 local_b80;
  undefined8 uStack_b78;
  undefined8 local_b70;
  undefined8 uStack_b68;
  undefined1 local_b60 [16];
  undefined1 local_b50 [16];
  undefined8 local_b40;
  undefined8 uStack_b38;
  undefined8 uStack_b30;
  undefined8 uStack_b28;
  undefined8 local_b20;
  undefined8 uStack_b18;
  undefined8 uStack_b10;
  undefined8 uStack_b08;
  undefined8 local_b00;
  undefined8 uStack_af8;
  undefined8 uStack_af0;
  undefined8 uStack_ae8;
  undefined8 local_ae0;
  undefined8 uStack_ad8;
  undefined8 uStack_ad0;
  undefined8 uStack_ac8;
  undefined8 local_ac0;
  undefined8 uStack_ab8;
  undefined8 uStack_ab0;
  undefined8 uStack_aa8;
  undefined1 local_a90 [16];
  undefined1 local_a80 [16];
  undefined4 local_a64;
  undefined8 local_a60;
  undefined8 uStack_a58;
  undefined8 uStack_a50;
  undefined8 uStack_a48;
  undefined8 local_a40;
  undefined8 uStack_a38;
  undefined8 uStack_a30;
  undefined8 uStack_a28;
  undefined8 local_a10;
  undefined8 uStack_a08;
  undefined8 local_a00;
  undefined8 uStack_9f8;
  undefined8 local_9f0;
  undefined8 uStack_9e8;
  undefined8 local_9e0;
  undefined8 uStack_9d8;
  undefined8 local_9d0;
  undefined8 uStack_9c8;
  undefined8 local_9c0;
  undefined8 uStack_9b8;
  undefined4 local_9a4;
  undefined8 local_9a0;
  undefined8 uStack_998;
  undefined4 local_984;
  undefined8 local_980;
  undefined8 uStack_978;
  undefined4 local_964;
  undefined8 local_960;
  undefined8 uStack_958;
  undefined8 local_950;
  undefined8 uStack_948;
  undefined8 local_940;
  undefined8 uStack_938;
  undefined8 local_930;
  undefined8 uStack_928;
  undefined8 local_920;
  undefined8 uStack_918;
  undefined8 local_910;
  undefined8 uStack_908;
  undefined8 local_900;
  undefined8 uStack_8f8;
  undefined8 local_8f0;
  undefined8 uStack_8e8;
  undefined8 local_8e0;
  undefined8 uStack_8d8;
  undefined8 local_8d0;
  undefined8 uStack_8c8;
  undefined8 local_8c0;
  undefined8 uStack_8b8;
  undefined8 local_8b0;
  undefined8 uStack_8a8;
  undefined8 local_8a0;
  undefined8 uStack_898;
  undefined8 local_890;
  undefined8 uStack_888;
  undefined8 local_880;
  undefined8 uStack_878;
  undefined8 local_870;
  undefined8 uStack_868;
  undefined8 local_860;
  undefined8 uStack_858;
  undefined8 local_850;
  undefined8 uStack_848;
  undefined8 local_840;
  undefined8 uStack_838;
  undefined8 local_830;
  undefined8 uStack_828;
  undefined8 local_820;
  undefined8 uStack_818;
  undefined8 local_810;
  undefined8 uStack_808;
  undefined8 local_800;
  undefined8 uStack_7f8;
  undefined8 local_7f0;
  undefined8 uStack_7e8;
  undefined8 local_7e0;
  undefined8 uStack_7d8;
  undefined8 local_7d0;
  undefined8 uStack_7c8;
  undefined8 local_7c0;
  undefined8 uStack_7b8;
  undefined8 local_7b0;
  undefined8 uStack_7a8;
  undefined8 local_7a0;
  undefined8 uStack_798;
  undefined8 local_790;
  undefined8 uStack_788;
  undefined8 local_780;
  undefined8 uStack_778;
  undefined8 local_770;
  undefined8 uStack_768;
  undefined8 local_760;
  undefined8 uStack_758;
  undefined8 local_750;
  undefined8 uStack_748;
  undefined8 local_740;
  undefined8 uStack_738;
  undefined8 local_730;
  undefined8 uStack_728;
  undefined8 local_720;
  undefined8 uStack_718;
  undefined8 local_710;
  undefined8 uStack_708;
  undefined8 local_700;
  undefined8 uStack_6f8;
  undefined8 local_6f0;
  undefined8 uStack_6e8;
  undefined8 local_6e0;
  undefined8 uStack_6d8;
  undefined8 local_6d0;
  undefined8 uStack_6c8;
  undefined8 local_6c0;
  undefined8 uStack_6b8;
  undefined8 local_6b0;
  undefined8 uStack_6a8;
  undefined8 local_6a0;
  undefined8 uStack_698;
  undefined8 local_690;
  undefined8 uStack_688;
  undefined8 local_680;
  undefined8 uStack_678;
  undefined8 local_670;
  undefined8 uStack_668;
  undefined8 local_660;
  undefined8 uStack_658;
  undefined8 local_650;
  undefined8 uStack_648;
  undefined8 local_640;
  undefined8 uStack_638;
  undefined8 local_630;
  undefined8 uStack_628;
  undefined8 local_620;
  undefined8 uStack_618;
  undefined8 local_610;
  undefined8 uStack_608;
  undefined8 local_600;
  undefined8 uStack_5f8;
  undefined8 local_5f0;
  undefined8 uStack_5e8;
  undefined8 local_5e0;
  undefined8 uStack_5d8;
  undefined8 local_5d0;
  undefined8 uStack_5c8;
  undefined8 local_5c0;
  undefined8 uStack_5b8;
  undefined8 local_5b0;
  undefined8 uStack_5a8;
  undefined8 local_5a0;
  undefined8 uStack_598;
  undefined8 local_590;
  undefined8 uStack_588;
  undefined8 local_580;
  undefined8 uStack_578;
  undefined8 local_570;
  undefined8 uStack_568;
  undefined8 local_560;
  undefined8 uStack_558;
  undefined8 local_550;
  undefined8 uStack_548;
  undefined8 local_540;
  undefined8 uStack_538;
  undefined8 local_530;
  undefined8 uStack_528;
  undefined8 local_520;
  undefined8 uStack_518;
  undefined8 local_510;
  undefined8 uStack_508;
  undefined8 local_500;
  undefined8 uStack_4f8;
  undefined8 local_4f0;
  undefined8 uStack_4e8;
  undefined8 local_4e0;
  undefined8 uStack_4d8;
  undefined8 local_4d0;
  undefined8 uStack_4c8;
  undefined8 local_4c0;
  undefined8 uStack_4b8;
  undefined8 local_4b0;
  undefined8 uStack_4a8;
  undefined8 local_4a0;
  undefined8 uStack_498;
  undefined8 local_490;
  undefined8 uStack_488;
  undefined8 local_480;
  undefined8 uStack_478;
  undefined8 local_470;
  undefined8 uStack_468;
  undefined8 local_460;
  undefined8 uStack_458;
  undefined8 local_450;
  undefined8 uStack_448;
  undefined8 local_440;
  undefined8 uStack_438;
  undefined8 local_430;
  undefined8 uStack_428;
  undefined8 local_420;
  undefined8 uStack_418;
  undefined8 local_410;
  undefined8 uStack_408;
  undefined8 local_400;
  undefined8 uStack_3f8;
  undefined8 local_3f0;
  undefined8 uStack_3e8;
  undefined8 local_3e0;
  undefined8 uStack_3d8;
  undefined8 local_3d0;
  undefined8 uStack_3c8;
  undefined8 local_3c0;
  undefined8 uStack_3b8;
  undefined8 local_3b0;
  undefined8 uStack_3a8;
  undefined8 local_3a0;
  undefined8 uStack_398;
  undefined8 local_390;
  undefined8 uStack_388;
  undefined8 local_380;
  undefined8 uStack_378;
  undefined8 local_370;
  undefined8 uStack_368;
  undefined8 local_360;
  undefined8 uStack_358;
  undefined8 local_350;
  undefined8 uStack_348;
  undefined8 local_340;
  undefined8 uStack_338;
  undefined8 local_330;
  undefined8 uStack_328;
  undefined8 local_320;
  undefined8 uStack_318;
  undefined8 local_310;
  undefined8 uStack_308;
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined8 local_2f0;
  undefined8 uStack_2e8;
  undefined8 local_2e0;
  undefined8 uStack_2d8;
  undefined8 local_2d0;
  undefined8 uStack_2c8;
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  undefined8 local_2b0;
  undefined8 uStack_2a8;
  undefined8 local_2a0;
  undefined8 uStack_298;
  undefined8 local_290;
  undefined8 uStack_288;
  undefined8 local_280;
  undefined8 uStack_278;
  undefined8 local_270;
  undefined8 uStack_268;
  undefined8 local_260;
  undefined8 uStack_258;
  undefined8 local_250;
  undefined8 uStack_248;
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 local_230;
  undefined8 uStack_228;
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 local_210;
  undefined8 uStack_208;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 local_1f0;
  undefined8 uStack_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 local_1d0;
  undefined8 uStack_1c8;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 local_1b0;
  undefined8 uStack_1a8;
  undefined8 local_1a0;
  undefined8 uStack_198;
  undefined8 local_190;
  undefined8 uStack_188;
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 local_170;
  undefined8 uStack_168;
  undefined8 local_160;
  undefined8 uStack_158;
  undefined8 local_150;
  undefined8 uStack_148;
  undefined8 local_140;
  undefined8 uStack_138;
  undefined8 local_130;
  undefined8 uStack_128;
  undefined8 local_120;
  undefined8 uStack_118;
  undefined8 local_110;
  undefined8 uStack_108;
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 local_f0;
  undefined8 uStack_e8;
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 local_d0;
  undefined8 uStack_c8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 local_b0;
  undefined8 uStack_a8;
  undefined8 local_a0;
  undefined8 uStack_98;
  undefined8 local_90;
  undefined8 uStack_88;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 local_70;
  undefined8 uStack_68;
  undefined8 local_60;
  undefined8 uStack_58;
  undefined8 local_50;
  undefined8 uStack_48;
  undefined8 local_40;
  undefined8 uStack_38;
  undefined1 auVar123 [24];
  undefined1 auVar124 [32];
  
  local_2c7c = *(int *)((long)in_RSI + 0x2c);
  local_2c80 = (int)in_RSI[6];
  local_2c84 = *(int *)((long)in_RSI + 0x34);
  local_2c88 = (int)in_RSI[7];
  local_2c8c = (int)in_RSI[3];
  local_2c90 = local_2c7c * local_2c80 * local_2c84 * local_2c8c;
  local_2c70 = in_RSI;
  for (local_2c94 = 0; local_2c94 < local_2c88; local_2c94 = local_2c94 + 1) {
    local_2c50 = &local_2ce8;
    local_2104 = *(int *)((long)local_2c70 + 0x2c);
    local_2108 = (int)local_2c70[6];
    local_210c = *(undefined4 *)((long)local_2c70 + 0x34);
    local_2118 = (undefined1 (*) [32])
                 (*local_2c70 + local_2c70[8] * (long)local_2c94 * local_2c70[2]);
    local_2120 = local_2c70[2];
    local_2124 = (undefined4)local_2c70[3];
    local_2130 = local_2c70[4];
    local_2100 = &local_2ce8;
    local_20f0 = (long)local_2104 * (long)local_2108 * local_2120;
    local_2c48 = &local_2ce8;
    local_2c38 = &local_2ce8;
    local_20f4 = 0x10;
    local_2c5c = local_2c94;
    local_2c5d = 1;
    local_2ce8 = 0;
    local_2cd8 = 0;
    local_2cd0 = 0;
    local_2cc0 = 0;
    local_2cbc = 0;
    local_2cb8 = 0;
    local_2cb4 = 0;
    local_2cb0 = 0;
    local_2ca8 = 0;
    local_2ce0 = 0;
    local_2cf8 = 0;
    local_2c24 = 0x3f800000;
    local_2064 = 0x3f800000;
    local_2068 = 0x3f800000;
    local_206c = 0x3f800000;
    local_2070 = 0x3f800000;
    local_2074 = 0x3f800000;
    local_2078 = 0x3f800000;
    local_207c = 0x3f800000;
    local_2080 = 0x3f800000;
    auVar4 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
    auVar4 = vinsertps_avx(auVar4,ZEXT416(0x3f800000),0x20);
    local_20a0 = vinsertps_avx(auVar4,ZEXT416(0x3f800000),0x30);
    auVar4 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
    auVar4 = vinsertps_avx(auVar4,ZEXT416(0x3f800000),0x20);
    auStack_2090 = vinsertps_avx(auVar4,ZEXT416(0x3f800000),0x30);
    local_2c00._8_8_ = SUB328(ZEXT832(0),4);
    local_2ca0 = local_2118;
    for (; local_2cf8 + 7 < local_2c90; local_2cf8 = local_2cf8 + 8) {
      local_2bc8 = local_2ca0;
      local_2ba0 = *(undefined8 *)*local_2ca0;
      uStack_2b98 = *(undefined8 *)(*local_2ca0 + 8);
      uStack_2b90 = *(undefined8 *)(*local_2ca0 + 0x10);
      uStack_2b88 = *(undefined8 *)(*local_2ca0 + 0x18);
      uStack_2d54 = (undefined4)((ulong)uStack_2b98 >> 0x20);
      uStack_2d50 = (undefined4)uStack_2b90;
      uStack_2d4c = (undefined4)((ulong)uStack_2b90 >> 0x20);
      uStack_2d48 = (undefined4)uStack_2b88;
      uStack_2d44 = (undefined4)((ulong)uStack_2b88 >> 0x20);
      auVar1._12_4_ = uStack_2d54;
      auVar1._0_12_ = *(undefined1 (*) [12])*local_2ca0;
      auVar1._16_4_ = uStack_2d50;
      auVar1._20_4_ = uStack_2d4c;
      auVar1._24_4_ = uStack_2d48;
      auVar1._28_4_ = uStack_2d44;
      local_2c20 = ZEXT1632(ZEXT816(0) << 0x40);
      auVar2 = vcmpps_avx(local_2c20,auVar1,1);
      local_2b80[0] = 0x7fffffff;
      local_2b80[1] = 0x7fffffff;
      aiStack_2b78[0] = 0x7fffffff;
      aiStack_2b78[1] = 0x7fffffff;
      aiStack_2b70[0] = 0x7fffffff;
      aiStack_2b70[1] = 0x7fffffff;
      aiStack_2b68[0] = 0x7fffffff;
      aiStack_2b68[1] = 0x7fffffff;
      auVar6._8_4_ = 0x7fffffff;
      auVar6._12_4_ = 0x7fffffff;
      auVar6._0_4_ = 0x7fffffff;
      auVar6._4_4_ = 0x7fffffff;
      auVar6._16_4_ = 0x7fffffff;
      auVar6._20_4_ = 0x7fffffff;
      auVar6._24_4_ = 0x7fffffff;
      auVar6._28_4_ = 0x7fffffff;
      auVar1 = vandps_avx(*local_2ca0,auVar6);
      local_2580 = 0;
      uStack_2578 = local_2c00._8_8_;
      uStack_2570 = 0;
      uStack_2568 = 0;
      local_2da0 = auVar1._0_8_;
      local_25a0 = local_2da0;
      uStack_2d98 = auVar1._8_8_;
      uStack_2598 = uStack_2d98;
      uStack_2d90 = auVar1._16_8_;
      uStack_2590 = uStack_2d90;
      uStack_2d88 = auVar1._24_8_;
      uStack_2588 = uStack_2d88;
      auVar1 = vsubps_avx(ZEXT832((ulong)local_2c00._8_8_) << 0x40,auVar1);
      local_2a80 = 0x3f8000003f800000;
      uStack_2a78 = 0x3f8000003f800000;
      uStack_2a70 = 0x3f8000003f800000;
      uStack_2a68 = 0x3f8000003f800000;
      local_2720._0_8_ = auVar1._0_8_;
      local_c40 = local_2720._0_8_;
      local_2720._8_8_ = auVar1._8_8_;
      uStack_c38 = local_2720._8_8_;
      local_2720._16_8_ = auVar1._16_8_;
      uStack_c30 = local_2720._16_8_;
      local_2720._24_8_ = auVar1._24_8_;
      uStack_c28 = local_2720._24_8_;
      local_c60 = 0x42b0c0a542b0c0a5;
      uStack_c58 = 0x42b0c0a542b0c0a5;
      uStack_c50 = 0x42b0c0a542b0c0a5;
      uStack_c48 = 0x42b0c0a542b0c0a5;
      auVar72._8_8_ = 0x42b0c0a542b0c0a5;
      auVar72._0_8_ = 0x42b0c0a542b0c0a5;
      auVar72._16_8_ = 0x42b0c0a542b0c0a5;
      auVar72._24_8_ = 0x42b0c0a542b0c0a5;
      auVar1 = vminps_avx(auVar1,auVar72);
      local_2720._0_8_ = auVar1._0_8_;
      local_2040 = local_2720._0_8_;
      local_2720._8_8_ = auVar1._8_8_;
      uStack_2038 = local_2720._8_8_;
      local_2720._16_8_ = auVar1._16_8_;
      uStack_2030 = local_2720._16_8_;
      local_2720._24_8_ = auVar1._24_8_;
      uStack_2028 = local_2720._24_8_;
      local_2060 = 0xc2b0c0a5c2b0c0a5;
      uStack_2058 = 0xc2b0c0a5c2b0c0a5;
      uStack_2050 = 0xc2b0c0a5c2b0c0a5;
      uStack_2048 = 0xc2b0c0a5c2b0c0a5;
      auVar33._8_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar33._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar33._16_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar33._24_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar6 = vmaxps_avx(auVar1,auVar33);
      local_2720._0_8_ = auVar6._0_8_;
      local_19a0 = local_2720._0_8_;
      local_2720._8_8_ = auVar6._8_8_;
      uStack_1998 = local_2720._8_8_;
      local_2720._16_8_ = auVar6._16_8_;
      uStack_1990 = local_2720._16_8_;
      local_2720._24_8_ = auVar6._24_8_;
      uStack_1988 = local_2720._24_8_;
      local_19c0 = 0x3fb8aa3b3fb8aa3b;
      uStack_19b8 = 0x3fb8aa3b3fb8aa3b;
      uStack_19b0 = 0x3fb8aa3b3fb8aa3b;
      uStack_19a8 = 0x3fb8aa3b3fb8aa3b;
      local_1ec0 = 0x3f0000003f000000;
      uStack_1eb8 = 0x3f0000003f000000;
      uStack_1eb0 = 0x3f0000003f000000;
      uStack_1ea8 = 0x3f0000003f000000;
      local_fe0 = local_2720._0_8_;
      uStack_fd8 = local_2720._8_8_;
      uStack_fd0 = local_2720._16_8_;
      uStack_fc8 = local_2720._24_8_;
      local_1000 = 0x3fb8aa3b3fb8aa3b;
      uStack_ff8 = 0x3fb8aa3b3fb8aa3b;
      uStack_ff0 = 0x3fb8aa3b3fb8aa3b;
      uStack_fe8 = 0x3fb8aa3b3fb8aa3b;
      local_1020 = 0x3f0000003f000000;
      uStack_1018 = 0x3f0000003f000000;
      uStack_1010 = 0x3f0000003f000000;
      uStack_1008 = 0x3f0000003f000000;
      auVar61._8_8_ = 0x3fb8aa3b3fb8aa3b;
      auVar61._0_8_ = 0x3fb8aa3b3fb8aa3b;
      auVar61._16_8_ = 0x3fb8aa3b3fb8aa3b;
      auVar61._24_8_ = 0x3fb8aa3b3fb8aa3b;
      auVar60._8_8_ = 0x3f0000003f000000;
      auVar60._0_8_ = 0x3f0000003f000000;
      auVar60._16_8_ = 0x3f0000003f000000;
      auVar60._24_8_ = 0x3f0000003f000000;
      auVar4 = vfmadd213ps_fma(auVar61,auVar6,auVar60);
      auVar7 = vroundps_avx(ZEXT1632(auVar4),1);
      auVar1 = vcmpps_avx(ZEXT1632(auVar4),auVar7,1);
      local_27c0._0_8_ = auVar1._0_8_;
      local_26c0 = local_27c0._0_8_;
      local_27c0._8_8_ = auVar1._8_8_;
      uStack_26b8 = local_27c0._8_8_;
      local_27c0._16_8_ = auVar1._16_8_;
      uStack_26b0 = local_27c0._16_8_;
      local_27c0._24_8_ = auVar1._24_8_;
      uStack_26a8 = local_27c0._24_8_;
      local_26e0 = 0x3f8000003f800000;
      uStack_26d8 = 0x3f8000003f800000;
      uStack_26d0 = 0x3f8000003f800000;
      uStack_26c8 = 0x3f8000003f800000;
      auVar24._8_8_ = 0x3f8000003f800000;
      auVar24._0_8_ = 0x3f8000003f800000;
      auVar24._16_8_ = 0x3f8000003f800000;
      auVar24._24_8_ = 0x3f8000003f800000;
      local_27c0 = vandps_avx(auVar1,auVar24);
      local_2740 = auVar7._0_8_;
      local_2640 = local_2740;
      uStack_2738 = auVar7._8_8_;
      uStack_2638 = uStack_2738;
      uStack_2730 = auVar7._16_8_;
      uStack_2630 = uStack_2730;
      uStack_2728 = auVar7._24_8_;
      uStack_2628 = uStack_2728;
      local_2660 = local_27c0._0_8_;
      uStack_2658 = local_27c0._8_8_;
      uStack_2650 = local_27c0._16_8_;
      uStack_2648 = local_27c0._24_8_;
      local_2760 = vsubps_avx(auVar7,local_27c0);
      local_1520 = local_2760._0_8_;
      uStack_1518 = local_2760._8_8_;
      uStack_1510 = local_2760._16_8_;
      uStack_1508 = local_2760._24_8_;
      local_1560 = local_2720._0_8_;
      uStack_1558 = local_2720._8_8_;
      uStack_1550 = local_2720._16_8_;
      uStack_1548 = local_2720._24_8_;
      local_1960 = 0x3f3180003f318000;
      uStack_1958 = 0x3f3180003f318000;
      uStack_1950 = 0x3f3180003f318000;
      uStack_1948 = 0x3f3180003f318000;
      local_ce0 = local_2760._0_8_;
      uStack_cd8 = local_2760._8_8_;
      uStack_cd0 = local_2760._16_8_;
      uStack_cc8 = local_2760._24_8_;
      local_d00 = 0x3f3180003f318000;
      uStack_cf8 = 0x3f3180003f318000;
      uStack_cf0 = 0x3f3180003f318000;
      uStack_ce8 = 0x3f3180003f318000;
      local_d20 = local_2720._0_8_;
      uStack_d18 = local_2720._8_8_;
      uStack_d10 = local_2720._16_8_;
      uStack_d08 = local_2720._24_8_;
      auVar70._8_8_ = 0x3f3180003f318000;
      auVar70._0_8_ = 0x3f3180003f318000;
      auVar70._16_8_ = 0x3f3180003f318000;
      auVar70._24_8_ = 0x3f3180003f318000;
      auVar4 = vfnmadd213ps_fma(auVar70,local_2760,auVar6);
      local_1580 = local_2760._0_8_;
      uStack_1578 = local_2760._8_8_;
      uStack_1570 = local_2760._16_8_;
      uStack_1568 = local_2760._24_8_;
      local_2720._0_8_ = auVar4._0_8_;
      local_15c0 = local_2720._0_8_;
      local_2720._8_8_ = auVar4._8_8_;
      uStack_15b8 = local_2720._8_8_;
      uStack_15b0 = 0;
      uStack_15a8 = 0;
      local_1900 = 0xb95e8083b95e8083;
      uStack_18f8 = 0xb95e8083b95e8083;
      uStack_18f0 = 0xb95e8083b95e8083;
      uStack_18e8 = 0xb95e8083b95e8083;
      local_c80 = local_2760._0_8_;
      uStack_c78 = local_2760._8_8_;
      uStack_c70 = local_2760._16_8_;
      uStack_c68 = local_2760._24_8_;
      local_ca0 = 0xb95e8083b95e8083;
      uStack_c98 = 0xb95e8083b95e8083;
      uStack_c90 = 0xb95e8083b95e8083;
      uStack_c88 = 0xb95e8083b95e8083;
      local_cc0 = local_2720._0_8_;
      uStack_cb8 = local_2720._8_8_;
      uStack_cb0 = 0;
      uStack_ca8 = 0;
      auVar71._8_8_ = 0xb95e8083b95e8083;
      auVar71._0_8_ = 0xb95e8083b95e8083;
      auVar71._16_8_ = 0xb95e8083b95e8083;
      auVar71._24_8_ = 0xb95e8083b95e8083;
      auVar8 = vfnmadd213ps_fma(auVar71,local_2760,ZEXT1632(auVar4));
      local_2720._0_8_ = auVar8._0_8_;
      local_1d20 = local_2720._0_8_;
      local_2720._8_8_ = auVar8._8_8_;
      uStack_1d18 = local_2720._8_8_;
      uStack_1d10 = 0;
      uStack_1d08 = 0;
      local_1d00._0_4_ = auVar8._0_4_;
      local_1d00._4_4_ = auVar8._4_4_;
      uStack_1cf8._0_4_ = auVar8._8_4_;
      uStack_1cf8._4_4_ = auVar8._12_4_;
      local_2740._4_4_ = local_1d00._4_4_ * local_1d00._4_4_;
      local_2740._0_4_ = (float)local_1d00 * (float)local_1d00;
      local_1c00 = local_2740;
      uStack_2738._0_4_ = (float)uStack_1cf8 * (float)uStack_1cf8;
      uStack_2738._4_4_ = uStack_1cf8._4_4_ * uStack_1cf8._4_4_;
      auVar3 = _local_2740;
      _local_2740 = ZEXT1632(_local_2740);
      auVar33 = _local_2740;
      uStack_27d8 = 0x3950696739506967;
      local_27e0 = (undefined1  [8])0x3950696739506967;
      local_1a00 = 0x3950696739506967;
      uStack_19f8 = 0x3950696739506967;
      uStack_19f0 = 0x3950696739506967;
      uStack_19e8 = 0x3950696739506967;
      local_1a20 = local_2720._0_8_;
      uStack_1a18 = local_2720._8_8_;
      uStack_1a10 = 0;
      uStack_1a08 = 0;
      local_1a40 = 0x3ab743ce3ab743ce;
      uStack_1a38 = 0x3ab743ce3ab743ce;
      uStack_1a30 = 0x3ab743ce3ab743ce;
      uStack_1a28 = 0x3ab743ce3ab743ce;
      local_f80 = 0x3950696739506967;
      uStack_f78 = 0x3950696739506967;
      uStack_f70 = 0x3950696739506967;
      uStack_f68 = 0x3950696739506967;
      local_fa0 = local_2720._0_8_;
      uStack_f98 = local_2720._8_8_;
      uStack_f90 = 0;
      uStack_f88 = 0;
      local_fc0 = 0x3ab743ce3ab743ce;
      uStack_fb8 = 0x3ab743ce3ab743ce;
      uStack_fb0 = 0x3ab743ce3ab743ce;
      uStack_fa8 = 0x3ab743ce3ab743ce;
      auVar63._16_8_ = 0x3950696739506967;
      auVar63._0_16_ = _local_27e0;
      auVar63._24_8_ = 0x3950696739506967;
      auVar62._8_8_ = 0x3ab743ce3ab743ce;
      auVar62._0_8_ = 0x3ab743ce3ab743ce;
      auVar62._16_8_ = 0x3ab743ce3ab743ce;
      auVar62._24_8_ = 0x3ab743ce3ab743ce;
      auVar4 = vfmadd213ps_fma(ZEXT1632(auVar8),auVar63,auVar62);
      local_27e0 = auVar4._0_8_;
      local_1a60 = local_27e0;
      uStack_27d8 = auVar4._8_8_;
      uStack_1a58 = uStack_27d8;
      uStack_1a50 = 0;
      uStack_1a48 = 0;
      local_1a80 = local_2720._0_8_;
      uStack_1a78 = local_2720._8_8_;
      uStack_1a70 = 0;
      uStack_1a68 = 0;
      local_1aa0 = 0x3c0889083c088908;
      uStack_1a98 = 0x3c0889083c088908;
      uStack_1a90 = 0x3c0889083c088908;
      uStack_1a88 = 0x3c0889083c088908;
      local_f20 = local_27e0;
      uStack_f18 = uStack_27d8;
      uStack_f10 = 0;
      uStack_f08 = 0;
      local_f40 = local_2720._0_8_;
      uStack_f38 = local_2720._8_8_;
      uStack_f30 = 0;
      uStack_f28 = 0;
      local_f60 = 0x3c0889083c088908;
      uStack_f58 = 0x3c0889083c088908;
      uStack_f50 = 0x3c0889083c088908;
      uStack_f48 = 0x3c0889083c088908;
      auVar64._8_8_ = 0x3c0889083c088908;
      auVar64._0_8_ = 0x3c0889083c088908;
      auVar64._16_8_ = 0x3c0889083c088908;
      auVar64._24_8_ = 0x3c0889083c088908;
      auVar4 = vfmadd213ps_fma(ZEXT1632(auVar8),ZEXT1632(auVar4),auVar64);
      local_27e0 = auVar4._0_8_;
      local_1ac0 = local_27e0;
      uStack_27d8 = auVar4._8_8_;
      uStack_1ab8 = uStack_27d8;
      uStack_1ab0 = 0;
      uStack_1aa8 = 0;
      local_1ae0 = local_2720._0_8_;
      uStack_1ad8 = local_2720._8_8_;
      uStack_1ad0 = 0;
      uStack_1ac8 = 0;
      local_1b00 = 0x3d2aa9c13d2aa9c1;
      uStack_1af8 = 0x3d2aa9c13d2aa9c1;
      uStack_1af0 = 0x3d2aa9c13d2aa9c1;
      uStack_1ae8 = 0x3d2aa9c13d2aa9c1;
      local_ec0 = local_27e0;
      uStack_eb8 = uStack_27d8;
      uStack_eb0 = 0;
      uStack_ea8 = 0;
      local_ee0 = local_2720._0_8_;
      uStack_ed8 = local_2720._8_8_;
      uStack_ed0 = 0;
      uStack_ec8 = 0;
      local_f00 = 0x3d2aa9c13d2aa9c1;
      uStack_ef8 = 0x3d2aa9c13d2aa9c1;
      uStack_ef0 = 0x3d2aa9c13d2aa9c1;
      uStack_ee8 = 0x3d2aa9c13d2aa9c1;
      auVar65._8_8_ = 0x3d2aa9c13d2aa9c1;
      auVar65._0_8_ = 0x3d2aa9c13d2aa9c1;
      auVar65._16_8_ = 0x3d2aa9c13d2aa9c1;
      auVar65._24_8_ = 0x3d2aa9c13d2aa9c1;
      auVar4 = vfmadd213ps_fma(ZEXT1632(auVar8),ZEXT1632(auVar4),auVar65);
      local_27e0 = auVar4._0_8_;
      local_1b20 = local_27e0;
      uStack_27d8 = auVar4._8_8_;
      uStack_1b18 = uStack_27d8;
      uStack_1b10 = 0;
      uStack_1b08 = 0;
      local_1b40 = local_2720._0_8_;
      uStack_1b38 = local_2720._8_8_;
      uStack_1b30 = 0;
      uStack_1b28 = 0;
      local_1b60 = 0x3e2aaaaa3e2aaaaa;
      uStack_1b58 = 0x3e2aaaaa3e2aaaaa;
      uStack_1b50 = 0x3e2aaaaa3e2aaaaa;
      uStack_1b48 = 0x3e2aaaaa3e2aaaaa;
      local_e60 = local_27e0;
      uStack_e58 = uStack_27d8;
      uStack_e50 = 0;
      uStack_e48 = 0;
      local_e80 = local_2720._0_8_;
      uStack_e78 = local_2720._8_8_;
      uStack_e70 = 0;
      uStack_e68 = 0;
      local_ea0 = 0x3e2aaaaa3e2aaaaa;
      uStack_e98 = 0x3e2aaaaa3e2aaaaa;
      uStack_e90 = 0x3e2aaaaa3e2aaaaa;
      uStack_e88 = 0x3e2aaaaa3e2aaaaa;
      auVar66._8_8_ = 0x3e2aaaaa3e2aaaaa;
      auVar66._0_8_ = 0x3e2aaaaa3e2aaaaa;
      auVar66._16_8_ = 0x3e2aaaaa3e2aaaaa;
      auVar66._24_8_ = 0x3e2aaaaa3e2aaaaa;
      auVar4 = vfmadd213ps_fma(ZEXT1632(auVar8),ZEXT1632(auVar4),auVar66);
      local_27e0 = auVar4._0_8_;
      local_1b80 = local_27e0;
      uStack_27d8 = auVar4._8_8_;
      uStack_1b78 = uStack_27d8;
      uStack_1b70 = 0;
      uStack_1b68 = 0;
      local_1ba0 = local_2720._0_8_;
      uStack_1b98 = local_2720._8_8_;
      uStack_1b90 = 0;
      uStack_1b88 = 0;
      local_e00 = local_27e0;
      uStack_df8 = uStack_27d8;
      uStack_df0 = 0;
      uStack_de8 = 0;
      local_e20 = local_2720._0_8_;
      uStack_e18 = local_2720._8_8_;
      uStack_e10 = 0;
      uStack_e08 = 0;
      local_e40 = 0x3f0000003f000000;
      uStack_e38 = 0x3f0000003f000000;
      uStack_e30 = 0x3f0000003f000000;
      uStack_e28 = 0x3f0000003f000000;
      auVar67._8_8_ = 0x3f0000003f000000;
      auVar67._0_8_ = 0x3f0000003f000000;
      auVar67._16_8_ = 0x3f0000003f000000;
      auVar67._24_8_ = 0x3f0000003f000000;
      auVar4 = vfmadd213ps_fma(ZEXT1632(auVar8),ZEXT1632(auVar4),auVar67);
      local_27e0 = auVar4._0_8_;
      local_1be0 = local_27e0;
      uStack_27d8 = auVar4._8_8_;
      uStack_1bd8 = uStack_27d8;
      uStack_1bd0 = 0;
      uStack_1bc8 = 0;
      uStack_2738 = auVar3._8_8_;
      uStack_1bf8 = uStack_2738;
      uStack_1bf0 = 0;
      uStack_1be8 = 0;
      local_1c20 = local_2720._0_8_;
      uStack_1c18 = local_2720._8_8_;
      uStack_1c10 = 0;
      uStack_1c08 = 0;
      local_da0 = local_27e0;
      uStack_d98 = uStack_27d8;
      uStack_d90 = 0;
      uStack_d88 = 0;
      local_dc0 = local_1c00;
      uStack_db8 = uStack_2738;
      uStack_db0 = 0;
      uStack_da8 = 0;
      local_de0 = local_2720._0_8_;
      uStack_dd8 = local_2720._8_8_;
      uStack_dd0 = 0;
      uStack_dc8 = 0;
      auVar4 = vfmadd213ps_fma(ZEXT1632(auVar3),ZEXT1632(auVar4),ZEXT1632(auVar8));
      local_27e0 = auVar4._0_8_;
      uVar9 = local_27e0;
      uStack_27d8 = auVar4._8_8_;
      uVar10 = uStack_27d8;
      uStack_2670 = 0;
      uStack_2668 = 0;
      local_26a0 = 0x3f8000003f800000;
      uStack_2698 = 0x3f8000003f800000;
      uStack_2690 = 0x3f8000003f800000;
      uStack_2688 = 0x3f8000003f800000;
      local_2680._0_4_ = auVar4._0_4_;
      local_2680._4_4_ = auVar4._4_4_;
      uStack_2678._0_4_ = auVar4._8_4_;
      uStack_2678._4_4_ = auVar4._12_4_;
      local_27e0._4_4_ = local_2680._4_4_ + 1.0;
      local_27e0._0_4_ = (float)local_2680 + 1.0;
      uStack_27d8._0_4_ = (float)uStack_2678 + 1.0;
      uStack_27d8._4_4_ = uStack_2678._4_4_ + 1.0;
      uStack_27d0._0_4_ = 0x3f800000;
      uStack_27d0._4_4_ = 0x3f800000;
      auVar123 = _local_27e0;
      uStack_27c8._0_4_ = 0x3f800000;
      uStack_27c8._4_4_ = 0x3f800000;
      auVar1 = _local_27e0;
      local_c20._0_4_ = local_2760._0_4_;
      local_c20._4_4_ = local_2760._4_4_;
      uStack_c18._0_4_ = local_2760._8_4_;
      uStack_c18._4_4_ = local_2760._12_4_;
      uStack_c10._0_4_ = local_2760._16_4_;
      uStack_c10._4_4_ = local_2760._20_4_;
      uStack_c08._0_4_ = local_2760._24_4_;
      uStack_c08._4_4_ = local_2760._28_4_;
      local_2780 = CONCAT44((int)local_c20._4_4_,(int)(float)local_c20);
      uStack_2778 = CONCAT44((int)uStack_c18._4_4_,(int)(float)uStack_c18);
      uStack_2770 = CONCAT44((int)uStack_c10._4_4_,(int)(float)uStack_c10);
      uStack_2768 = CONCAT44((int)uStack_c08._4_4_,(int)(float)uStack_c08);
      local_b20 = local_2780;
      uStack_b18 = uStack_2778;
      uStack_b10 = uStack_2770;
      uStack_b08 = uStack_2768;
      local_1dc0 = 0x7f0000007f;
      uStack_1db8 = 0x7f0000007f;
      uStack_1db0 = 0x7f0000007f;
      uStack_1da8 = 0x7f0000007f;
      local_bc0 = local_2780;
      uStack_bb8 = uStack_2778;
      uStack_bb0 = uStack_2770;
      uStack_ba8 = uStack_2768;
      local_be0 = 0x7f0000007f;
      uStack_bd8 = 0x7f0000007f;
      uStack_bd0 = 0x7f0000007f;
      uStack_bc8 = 0x7f0000007f;
      local_b70 = 0x7f0000007f;
      uStack_b68 = 0x7f0000007f;
      local_b80 = 0x7f0000007f;
      uStack_b78 = 0x7f0000007f;
      local_9e0 = local_2780;
      uStack_9d8 = uStack_2778;
      local_9f0 = 0x7f0000007f;
      uStack_9e8 = 0x7f0000007f;
      auVar75._8_8_ = uStack_2778;
      auVar75._0_8_ = local_2780;
      auVar74._8_8_ = 0x7f0000007f;
      auVar74._0_8_ = 0x7f0000007f;
      local_b50 = vpaddd_avx(auVar74,auVar75);
      local_a00 = uStack_2770;
      uStack_9f8 = uStack_2768;
      local_a10 = 0x7f0000007f;
      uStack_a08 = 0x7f0000007f;
      auVar73._8_8_ = uStack_2768;
      auVar73._0_8_ = uStack_2770;
      auVar5._8_8_ = 0x7f0000007f;
      auVar5._0_8_ = 0x7f0000007f;
      local_b60 = vpaddd_avx(auVar5,auVar73);
      local_c00 = local_b50._0_8_;
      uStack_bf8 = local_b50._8_8_;
      uStack_bf0 = local_b60._0_8_;
      uStack_be8 = local_b60._8_8_;
      local_ba0 = local_b50._0_8_;
      uStack_b98 = local_b50._8_8_;
      uStack_b90 = local_b60._0_8_;
      uStack_b88 = local_b60._8_8_;
      local_a60 = local_b50._0_8_;
      uStack_a58 = local_b50._8_8_;
      uStack_a50 = local_b60._0_8_;
      uStack_a48 = local_b60._8_8_;
      local_a64 = 0x17;
      local_ae0 = local_b50._0_8_;
      uStack_ad8 = local_b50._8_8_;
      uStack_ad0 = local_b60._0_8_;
      uStack_ac8 = local_b60._8_8_;
      local_980 = local_b50._0_8_;
      uStack_978 = local_b50._8_8_;
      local_984 = 0x17;
      local_a80 = vpslld_avx(local_b50,ZEXT416(0x17));
      local_9a0 = local_b60._0_8_;
      uStack_998 = local_b60._8_8_;
      local_9a4 = 0x17;
      local_a90 = vpslld_avx(local_b60,ZEXT416(0x17));
      local_b00 = local_a80._0_8_;
      uStack_af8 = local_a80._8_8_;
      uStack_af0 = local_a90._0_8_;
      uStack_ae8 = local_a90._8_8_;
      local_ac0 = local_a80._0_8_;
      uStack_ab8 = local_a80._8_8_;
      uStack_ab0 = local_a90._0_8_;
      uStack_aa8 = local_a90._8_8_;
      local_2780 = local_a80._0_8_;
      uStack_2778 = local_a80._8_8_;
      uStack_2770 = local_a90._0_8_;
      uStack_2768 = local_a90._8_8_;
      local_a40 = local_a80._0_8_;
      uStack_a38 = local_a80._8_8_;
      uStack_a30 = local_a90._0_8_;
      uStack_a28 = local_a90._8_8_;
      local_2800 = local_a80._0_8_;
      uStack_27f8 = local_a80._8_8_;
      uStack_27f0 = local_a90._0_8_;
      uStack_27e8 = local_a90._8_8_;
      local_1d40 = local_27e0;
      uStack_1d38 = uStack_27d8;
      uStack_27d0 = auVar123._16_8_;
      uStack_1d30 = uStack_27d0;
      uStack_27c8 = auVar1._24_8_;
      uStack_1d28 = uStack_27c8;
      local_1d60 = local_a80._0_8_;
      uStack_1d58 = local_a80._8_8_;
      uStack_1d50 = local_a90._0_8_;
      uStack_1d48 = local_a90._8_8_;
      local_27e0._0_4_ = local_a80._0_4_ * ((float)local_2680 + 1.0);
      local_27e0._4_4_ = local_a80._4_4_ * (local_2680._4_4_ + 1.0);
      fVar125 = local_a80._8_4_ * ((float)uStack_2678 + 1.0);
      fVar126 = local_a80._12_4_ * (uStack_2678._4_4_ + 1.0);
      fVar127 = local_a90._0_4_ * 1.0;
      fVar128 = local_a90._4_4_ * 1.0;
      fVar129 = local_a90._8_4_ * 1.0;
      uStack_27d8._0_4_ = fVar125;
      uStack_27d8._4_4_ = fVar126;
      uStack_27d0._0_4_ = fVar127;
      uStack_27d0._4_4_ = fVar128;
      auVar123 = _local_27e0;
      uStack_27c8._0_4_ = fVar129;
      uStack_27c8._4_4_ = 0x3f800000;
      auVar24 = _local_27e0;
      local_2840 = local_27e0;
      uStack_2838 = uStack_27d8;
      uStack_27d0 = auVar123._16_8_;
      uStack_2830 = uStack_27d0;
      uStack_27c8 = auVar24._24_8_;
      uStack_2828 = uStack_27c8;
      local_2820._0_4_ = local_20a0._0_4_;
      local_2820._4_4_ = local_20a0._4_4_;
      uStack_2818._0_4_ = local_20a0._8_4_;
      uStack_2818._4_4_ = local_20a0._12_4_;
      uStack_2810._0_4_ = auStack_2090._0_4_;
      uStack_2810._4_4_ = auStack_2090._4_4_;
      uStack_2808._0_4_ = auStack_2090._8_4_;
      uStack_2808._4_4_ = auStack_2090._12_4_;
      auVar121._0_8_ =
           CONCAT44(local_2820._4_4_ + (float)local_27e0._4_4_,
                    (float)local_2820 + (float)local_27e0._0_4_);
      auVar121._8_4_ = (float)uStack_2818 + fVar125;
      auVar121._12_4_ = uStack_2818._4_4_ + fVar126;
      auVar123._16_4_ = (float)uStack_2810 + fVar127;
      auVar123._0_16_ = auVar121;
      auVar123._20_4_ = uStack_2810._4_4_ + fVar128;
      auVar124._24_4_ = (float)uStack_2808 + fVar129;
      auVar124._0_24_ = auVar123;
      auVar124._28_4_ = uStack_2808._4_4_ + 1.0;
      local_2a20 = ZEXT1632(ZEXT816(0) << 0x40);
      local_2aa0 = vcmpps_avx(auVar124,local_2a20,2);
      uStack_2a38 = auVar121._8_8_;
      uStack_1ff8 = uStack_2a38;
      uStack_2a30 = auVar123._16_8_;
      uStack_1ff0 = uStack_2a30;
      uStack_2a28 = auVar124._24_8_;
      uStack_1fe8 = uStack_2a28;
      local_2020 = 0x80000000800000;
      uStack_2018 = 0x80000000800000;
      uStack_2010 = 0x80000000800000;
      uStack_2008 = 0x80000000800000;
      auVar35._16_8_ = uStack_2a30;
      auVar35._0_16_ = auVar121;
      auVar35._24_8_ = uStack_2a28;
      auVar34._8_8_ = 0x80000000800000;
      auVar34._0_8_ = 0x80000000800000;
      auVar34._16_8_ = 0x80000000800000;
      auVar34._24_8_ = 0x80000000800000;
      auVar1 = vmaxps_avx(auVar35,auVar34);
      local_2a40 = auVar1._0_8_;
      local_1f20 = local_2a40;
      uStack_2a38 = auVar1._8_8_;
      uStack_1f18 = uStack_2a38;
      uStack_2a30 = auVar1._16_8_;
      uStack_1f10 = uStack_2a30;
      uStack_2a28 = auVar1._24_8_;
      uStack_1f08 = uStack_2a28;
      local_1f40 = local_2a40;
      uStack_1f38 = uStack_2a38;
      uStack_1f30 = uStack_2a30;
      uStack_1f28 = uStack_2a28;
      local_1f44 = 0x17;
      local_1fc0 = local_2a40;
      uStack_1fb8 = uStack_2a38;
      uStack_1fb0 = uStack_2a30;
      uStack_1fa8 = uStack_2a28;
      local_1470 = local_2a40;
      uStack_1468 = uStack_2a38;
      local_1474 = 0x17;
      local_1f60 = vpsrld_avx(auVar1._0_16_,ZEXT416(0x17));
      local_1490 = uStack_2a30;
      uStack_1488 = uStack_2a28;
      local_1494 = 0x17;
      local_1f70 = vpsrld_avx(auVar1._16_16_,ZEXT416(0x17));
      local_1fe0 = local_1f60._0_8_;
      uStack_1fd8 = local_1f60._8_8_;
      uStack_1fd0 = local_1f70._0_8_;
      uStack_1fc8 = local_1f70._8_8_;
      local_1fa0 = local_1f60._0_8_;
      uStack_1f98 = local_1f60._8_8_;
      uStack_1f90 = local_1f70._0_8_;
      uStack_1f88 = local_1f70._8_8_;
      local_2960 = local_2a40;
      uStack_2958 = uStack_2a38;
      uStack_2950 = uStack_2a30;
      uStack_2948 = uStack_2a28;
      local_2980 = 0x807fffff807fffff;
      uStack_2978 = 0x807fffff807fffff;
      uStack_2970 = 0x807fffff807fffff;
      uStack_2968 = 0x807fffff807fffff;
      auVar23._8_8_ = 0x807fffff807fffff;
      auVar23._0_8_ = 0x807fffff807fffff;
      auVar23._16_8_ = 0x807fffff807fffff;
      auVar23._24_8_ = 0x807fffff807fffff;
      auVar1 = vandps_avx(auVar1,auVar23);
      local_2a40 = auVar1._0_8_;
      local_1ea0 = local_2a40;
      uStack_2a38 = auVar1._8_8_;
      uStack_1e98 = uStack_2a38;
      uStack_2a30 = auVar1._16_8_;
      uStack_1e90 = uStack_2a30;
      uStack_2a28 = auVar1._24_8_;
      uStack_1e88 = uStack_2a28;
      auVar36._8_8_ = 0x3f0000003f000000;
      auVar36._0_8_ = 0x3f0000003f000000;
      auVar36._16_8_ = 0x3f0000003f000000;
      auVar36._24_8_ = 0x3f0000003f000000;
      auVar6 = vorps_avx(auVar1,auVar36);
      local_1da0 = local_1f60._0_8_;
      uStack_1d98 = local_1f60._8_8_;
      uStack_1d90 = local_1f70._0_8_;
      uStack_1d88 = local_1f70._8_8_;
      local_1e40 = local_1f60._0_8_;
      uStack_1e38 = local_1f60._8_8_;
      uStack_1e30 = local_1f70._0_8_;
      uStack_1e28 = local_1f70._8_8_;
      local_1e60 = 0x7f0000007f;
      uStack_1e58 = 0x7f0000007f;
      uStack_1e50 = 0x7f0000007f;
      uStack_1e48 = 0x7f0000007f;
      local_1df0 = 0x7f0000007f;
      uStack_1de8 = 0x7f0000007f;
      local_1e00 = 0x7f0000007f;
      uStack_1df8 = 0x7f0000007f;
      local_1410 = local_1f60._0_8_;
      uStack_1408 = local_1f60._8_8_;
      local_1420 = 0x7f0000007f;
      uStack_1418 = 0x7f0000007f;
      auVar3._8_8_ = 0x7f0000007f;
      auVar3._0_8_ = 0x7f0000007f;
      local_1dd0 = vpsubd_avx(local_1f60,auVar3);
      local_1430 = local_1f70._0_8_;
      uStack_1428 = local_1f70._8_8_;
      local_1440 = 0x7f0000007f;
      uStack_1438 = 0x7f0000007f;
      auVar4._8_8_ = 0x7f0000007f;
      auVar4._0_8_ = 0x7f0000007f;
      local_1de0 = vpsubd_avx(local_1f70,auVar4);
      local_1e80 = local_1dd0._0_8_;
      uStack_1e78 = local_1dd0._8_8_;
      uStack_1e70 = local_1de0._0_8_;
      uStack_1e68 = local_1de0._8_8_;
      local_1e20 = local_1dd0._0_8_;
      uStack_1e18 = local_1dd0._8_8_;
      uStack_1e10 = local_1de0._0_8_;
      uStack_1e08 = local_1de0._8_8_;
      local_2a60 = local_1dd0._0_8_;
      uStack_2a58 = local_1dd0._8_8_;
      uStack_2a50 = local_1de0._0_8_;
      uStack_2a48 = local_1de0._8_8_;
      local_1d80 = local_1dd0._0_8_;
      uStack_1d78 = local_1dd0._8_8_;
      uStack_1d70 = local_1de0._0_8_;
      uStack_1d68 = local_1de0._8_8_;
      auVar37._16_8_ = local_1de0._0_8_;
      auVar37._0_16_ = local_1dd0;
      auVar37._24_8_ = local_1de0._8_8_;
      auVar1 = vcvtdq2ps_avx(auVar37);
      local_2ac0 = auVar1._0_8_;
      uVar11 = local_2ac0;
      uStack_2ab8 = auVar1._8_8_;
      uVar12 = uStack_2ab8;
      uStack_2ab0 = auVar1._16_8_;
      uVar13 = uStack_2ab0;
      uStack_2aa8 = auVar1._24_8_;
      uVar14 = uStack_2aa8;
      local_28c0 = 0x3f8000003f800000;
      uStack_28b8 = 0x3f8000003f800000;
      uStack_28b0 = 0x3f8000003f800000;
      uStack_28a8 = 0x3f8000003f800000;
      local_28a0._0_4_ = auVar1._0_4_;
      local_28a0._4_4_ = auVar1._4_4_;
      uStack_2898._0_4_ = auVar1._8_4_;
      uStack_2898._4_4_ = auVar1._12_4_;
      uStack_2890._0_4_ = auVar1._16_4_;
      uStack_2890._4_4_ = auVar1._20_4_;
      uStack_2888._0_4_ = auVar1._24_4_;
      uStack_2888._4_4_ = auVar1._28_4_;
      local_2ac0._4_4_ = local_28a0._4_4_ + 1.0;
      local_2ac0._0_4_ = (float)local_28a0 + 1.0;
      uStack_2ab8._0_4_ = (float)uStack_2898 + 1.0;
      uStack_2ab8._4_4_ = uStack_2898._4_4_ + 1.0;
      uStack_2ab0._0_4_ = (float)uStack_2890 + 1.0;
      uStack_2ab0._4_4_ = uStack_2890._4_4_ + 1.0;
      auVar123 = _local_2ac0;
      uStack_2aa8._0_4_ = (float)uStack_2888 + 1.0;
      uStack_2aa8._4_4_ = uStack_2888._4_4_ + 1.0;
      auVar7 = _local_2ac0;
      local_2ae0 = vcmpps_avx(auVar6,_DAT_01f0b0a0,1);
      local_2a40 = auVar6._0_8_;
      local_29a0 = local_2a40;
      uStack_2a38 = auVar6._8_8_;
      uStack_2998 = uStack_2a38;
      uStack_2a30 = auVar6._16_8_;
      uStack_2990 = uStack_2a30;
      uStack_2a28 = auVar6._24_8_;
      uStack_2988 = uStack_2a28;
      local_29c0 = local_2ae0._0_8_;
      uStack_29b8 = local_2ae0._8_8_;
      uStack_29b0 = local_2ae0._16_8_;
      uStack_29a8 = local_2ae0._24_8_;
      local_2b00 = vandps_avx(auVar6,local_2ae0);
      local_25c0 = local_2a40;
      uStack_25b8 = uStack_2a38;
      uStack_25b0 = uStack_2a30;
      uStack_25a8 = uStack_2a28;
      local_25e0 = 0x3f8000003f800000;
      uStack_25d8 = 0x3f8000003f800000;
      uStack_25d0 = 0x3f8000003f800000;
      uStack_25c8 = 0x3f8000003f800000;
      auVar26._8_8_ = 0x3f8000003f800000;
      auVar26._0_8_ = 0x3f8000003f800000;
      auVar26._16_8_ = 0x3f8000003f800000;
      auVar26._24_8_ = 0x3f8000003f800000;
      auVar1 = vsubps_avx(auVar6,auVar26);
      local_2600 = local_2ac0;
      uStack_25f8 = uStack_2ab8;
      uStack_2ab0 = auVar123._16_8_;
      uStack_25f0 = uStack_2ab0;
      uStack_2aa8 = auVar7._24_8_;
      uStack_25e8 = uStack_2aa8;
      local_29e0 = 0x3f8000003f800000;
      uStack_29d8 = 0x3f8000003f800000;
      uStack_29d0 = 0x3f8000003f800000;
      uStack_29c8 = 0x3f8000003f800000;
      local_2a00 = local_2ae0._0_8_;
      uStack_29f8 = local_2ae0._8_8_;
      uStack_29f0 = local_2ae0._16_8_;
      uStack_29e8 = local_2ae0._24_8_;
      auVar7._8_8_ = 0x3f8000003f800000;
      auVar7._0_8_ = 0x3f8000003f800000;
      auVar7._16_8_ = 0x3f8000003f800000;
      auVar7._24_8_ = 0x3f8000003f800000;
      local_2620 = vandps_avx(auVar7,local_2ae0);
      auVar25._16_8_ = uStack_2ab0;
      auVar25._0_16_ = _local_2ac0;
      auVar25._24_8_ = uStack_2aa8;
      _local_2ac0 = vsubps_avx(auVar25,local_2620);
      local_2a40 = auVar1._0_8_;
      uVar15 = local_2a40;
      uStack_2a38 = auVar1._8_8_;
      uVar16 = uStack_2a38;
      uStack_2a30 = auVar1._16_8_;
      uVar17 = uStack_2a30;
      uStack_2a28 = auVar1._24_8_;
      uVar18 = uStack_2a28;
      local_28e0._0_4_ = auVar1._0_4_;
      local_28e0._4_4_ = auVar1._4_4_;
      uStack_28d8._0_4_ = auVar1._8_4_;
      uStack_28d8._4_4_ = auVar1._12_4_;
      uStack_28d0._0_4_ = auVar1._16_4_;
      uStack_28d0._4_4_ = auVar1._20_4_;
      uStack_28c8._0_4_ = auVar1._24_4_;
      uStack_28c8._4_4_ = auVar1._28_4_;
      local_2900._0_4_ = local_2b00._0_4_;
      local_2900._4_4_ = local_2b00._4_4_;
      uStack_28f8._0_4_ = local_2b00._8_4_;
      uStack_28f8._4_4_ = local_2b00._12_4_;
      uStack_28f0._0_4_ = local_2b00._16_4_;
      uStack_28f0._4_4_ = local_2b00._20_4_;
      uStack_28e8._0_4_ = local_2b00._24_4_;
      uStack_28e8._4_4_ = local_2b00._28_4_;
      local_2a40._0_4_ = (float)local_28e0 + (float)local_2900;
      local_2a40._4_4_ = local_28e0._4_4_ + local_2900._4_4_;
      uStack_28d8._0_4_ = (float)uStack_28d8 + (float)uStack_28f8;
      uStack_28d8._4_4_ = uStack_28d8._4_4_ + uStack_28f8._4_4_;
      uStack_28d0._0_4_ = (float)uStack_28d0 + (float)uStack_28f0;
      uStack_28d0._4_4_ = uStack_28d0._4_4_ + uStack_28f0._4_4_;
      uStack_28c8._0_4_ = (float)uStack_28c8 + (float)uStack_28e8;
      fStack_2b04 = uStack_28c8._4_4_ + uStack_28e8._4_4_;
      uStack_2a38._0_4_ = (float)uStack_28d8;
      uStack_2a38._4_4_ = uStack_28d8._4_4_;
      uStack_2a30._0_4_ = (float)uStack_28d0;
      uStack_2a30._4_4_ = uStack_28d0._4_4_;
      auVar123 = _local_2a40;
      uStack_2a28._0_4_ = (float)uStack_28c8;
      uStack_2a28._4_4_ = fStack_2b04;
      auVar1 = _local_2a40;
      local_1c60 = local_2a40;
      uStack_1c58 = uStack_2a38;
      uStack_2a30 = auVar123._16_8_;
      uStack_1c50 = uStack_2a30;
      uStack_2a28 = auVar1._24_8_;
      uStack_1c48 = uStack_2a28;
      local_2b20 = (float)local_2a40._0_4_ * (float)local_2a40._0_4_;
      fStack_2b1c = (float)local_2a40._4_4_ * (float)local_2a40._4_4_;
      fStack_2b18 = (float)uStack_28d8 * (float)uStack_28d8;
      fStack_2b14 = uStack_28d8._4_4_ * uStack_28d8._4_4_;
      fStack_2b10 = (float)uStack_28d0 * (float)uStack_28d0;
      fStack_2b0c = uStack_28d0._4_4_ * uStack_28d0._4_4_;
      fStack_2b08 = (float)uStack_28c8 * (float)uStack_28c8;
      uStack_2b38 = 0x3d9021bb3d9021bb;
      local_2b40 = (undefined1  [8])0x3d9021bb3d9021bb;
      local_15e0 = 0x3d9021bb3d9021bb;
      uStack_15d8 = 0x3d9021bb3d9021bb;
      uStack_15d0 = 0x3d9021bb3d9021bb;
      uStack_15c8 = 0x3d9021bb3d9021bb;
      local_1600 = local_2a40;
      uStack_15f8 = uStack_2a38;
      uStack_15f0 = uStack_2a30;
      uStack_15e8 = uStack_2a28;
      local_1620 = 0xbdebd1b8bdebd1b8;
      uStack_1618 = 0xbdebd1b8bdebd1b8;
      uStack_1610 = 0xbdebd1b8bdebd1b8;
      uStack_1608 = 0xbdebd1b8bdebd1b8;
      local_13a0 = 0x3d9021bb3d9021bb;
      uStack_1398 = 0x3d9021bb3d9021bb;
      uStack_1390 = 0x3d9021bb3d9021bb;
      uStack_1388 = 0x3d9021bb3d9021bb;
      local_13c0 = local_2a40;
      uStack_13b8 = uStack_2a38;
      uStack_13b0 = uStack_2a30;
      uStack_13a8 = uStack_2a28;
      local_13e0 = 0xbdebd1b8bdebd1b8;
      uStack_13d8 = 0xbdebd1b8bdebd1b8;
      uStack_13d0 = 0xbdebd1b8bdebd1b8;
      uStack_13c8 = 0xbdebd1b8bdebd1b8;
      auVar41._16_8_ = 0x3d9021bb3d9021bb;
      auVar41._0_16_ = _local_2b40;
      auVar41._24_8_ = 0x3d9021bb3d9021bb;
      auVar40._16_8_ = uStack_2a30;
      auVar40._0_16_ = _local_2a40;
      auVar40._24_8_ = uStack_2a28;
      auVar39._8_8_ = 0xbdebd1b8bdebd1b8;
      auVar39._0_8_ = 0xbdebd1b8bdebd1b8;
      auVar39._16_8_ = 0xbdebd1b8bdebd1b8;
      auVar39._24_8_ = 0xbdebd1b8bdebd1b8;
      auVar4 = vfmadd213ps_fma(auVar40,auVar41,auVar39);
      local_2b40 = auVar4._0_8_;
      local_1640 = local_2b40;
      uStack_2b38 = auVar4._8_8_;
      uStack_1638 = uStack_2b38;
      uStack_1630 = 0;
      uStack_1628 = 0;
      local_1660 = local_2a40;
      uStack_1658 = uStack_2a38;
      uStack_1650 = uStack_2a30;
      uStack_1648 = uStack_2a28;
      local_1680 = 0x3def251a3def251a;
      uStack_1678 = 0x3def251a3def251a;
      uStack_1670 = 0x3def251a3def251a;
      uStack_1668 = 0x3def251a3def251a;
      local_1340 = local_2b40;
      uStack_1338 = uStack_2b38;
      uStack_1330 = 0;
      uStack_1328 = 0;
      local_1360 = local_2a40;
      uStack_1358 = uStack_2a38;
      uStack_1350 = uStack_2a30;
      uStack_1348 = uStack_2a28;
      local_1380 = 0x3def251a3def251a;
      uStack_1378 = 0x3def251a3def251a;
      uStack_1370 = 0x3def251a3def251a;
      uStack_1368 = 0x3def251a3def251a;
      auVar43._16_8_ = uStack_2a30;
      auVar43._0_16_ = _local_2a40;
      auVar43._24_8_ = uStack_2a28;
      auVar42._8_8_ = 0x3def251a3def251a;
      auVar42._0_8_ = 0x3def251a3def251a;
      auVar42._16_8_ = 0x3def251a3def251a;
      auVar42._24_8_ = 0x3def251a3def251a;
      auVar4 = vfmadd213ps_fma(auVar43,ZEXT1632(auVar4),auVar42);
      local_2b40 = auVar4._0_8_;
      local_16a0 = local_2b40;
      uStack_2b38 = auVar4._8_8_;
      uStack_1698 = uStack_2b38;
      uStack_1690 = 0;
      uStack_1688 = 0;
      local_16c0 = local_2a40;
      uStack_16b8 = uStack_2a38;
      uStack_16b0 = uStack_2a30;
      uStack_16a8 = uStack_2a28;
      local_16e0 = 0xbdfe5d4fbdfe5d4f;
      uStack_16d8 = 0xbdfe5d4fbdfe5d4f;
      uStack_16d0 = 0xbdfe5d4fbdfe5d4f;
      uStack_16c8 = 0xbdfe5d4fbdfe5d4f;
      local_12e0 = local_2b40;
      uStack_12d8 = uStack_2b38;
      uStack_12d0 = 0;
      uStack_12c8 = 0;
      local_1300 = local_2a40;
      uStack_12f8 = uStack_2a38;
      uStack_12f0 = uStack_2a30;
      uStack_12e8 = uStack_2a28;
      local_1320 = 0xbdfe5d4fbdfe5d4f;
      uStack_1318 = 0xbdfe5d4fbdfe5d4f;
      uStack_1310 = 0xbdfe5d4fbdfe5d4f;
      uStack_1308 = 0xbdfe5d4fbdfe5d4f;
      auVar45._16_8_ = uStack_2a30;
      auVar45._0_16_ = _local_2a40;
      auVar45._24_8_ = uStack_2a28;
      auVar44._8_8_ = 0xbdfe5d4fbdfe5d4f;
      auVar44._0_8_ = 0xbdfe5d4fbdfe5d4f;
      auVar44._16_8_ = 0xbdfe5d4fbdfe5d4f;
      auVar44._24_8_ = 0xbdfe5d4fbdfe5d4f;
      auVar4 = vfmadd213ps_fma(auVar45,ZEXT1632(auVar4),auVar44);
      local_2b40 = auVar4._0_8_;
      local_1700 = local_2b40;
      uStack_2b38 = auVar4._8_8_;
      uStack_16f8 = uStack_2b38;
      uStack_16f0 = 0;
      uStack_16e8 = 0;
      local_1720 = local_2a40;
      uStack_1718 = uStack_2a38;
      uStack_1710 = uStack_2a30;
      uStack_1708 = uStack_2a28;
      local_1740 = 0x3e11e9bf3e11e9bf;
      uStack_1738 = 0x3e11e9bf3e11e9bf;
      uStack_1730 = 0x3e11e9bf3e11e9bf;
      uStack_1728 = 0x3e11e9bf3e11e9bf;
      local_1280 = local_2b40;
      uStack_1278 = uStack_2b38;
      uStack_1270 = 0;
      uStack_1268 = 0;
      local_12a0 = local_2a40;
      uStack_1298 = uStack_2a38;
      uStack_1290 = uStack_2a30;
      uStack_1288 = uStack_2a28;
      local_12c0 = 0x3e11e9bf3e11e9bf;
      uStack_12b8 = 0x3e11e9bf3e11e9bf;
      uStack_12b0 = 0x3e11e9bf3e11e9bf;
      uStack_12a8 = 0x3e11e9bf3e11e9bf;
      auVar47._16_8_ = uStack_2a30;
      auVar47._0_16_ = _local_2a40;
      auVar47._24_8_ = uStack_2a28;
      auVar46._8_8_ = 0x3e11e9bf3e11e9bf;
      auVar46._0_8_ = 0x3e11e9bf3e11e9bf;
      auVar46._16_8_ = 0x3e11e9bf3e11e9bf;
      auVar46._24_8_ = 0x3e11e9bf3e11e9bf;
      auVar4 = vfmadd213ps_fma(auVar47,ZEXT1632(auVar4),auVar46);
      local_2b40 = auVar4._0_8_;
      local_1760 = local_2b40;
      uStack_2b38 = auVar4._8_8_;
      uStack_1758 = uStack_2b38;
      uStack_1750 = 0;
      uStack_1748 = 0;
      local_1780 = local_2a40;
      uStack_1778 = uStack_2a38;
      uStack_1770 = uStack_2a30;
      uStack_1768 = uStack_2a28;
      local_17a0 = 0xbe2aae50be2aae50;
      uStack_1798 = 0xbe2aae50be2aae50;
      uStack_1790 = 0xbe2aae50be2aae50;
      uStack_1788 = 0xbe2aae50be2aae50;
      local_1220 = local_2b40;
      uStack_1218 = uStack_2b38;
      uStack_1210 = 0;
      uStack_1208 = 0;
      local_1240 = local_2a40;
      uStack_1238 = uStack_2a38;
      uStack_1230 = uStack_2a30;
      uStack_1228 = uStack_2a28;
      local_1260 = 0xbe2aae50be2aae50;
      uStack_1258 = 0xbe2aae50be2aae50;
      uStack_1250 = 0xbe2aae50be2aae50;
      uStack_1248 = 0xbe2aae50be2aae50;
      auVar49._16_8_ = uStack_2a30;
      auVar49._0_16_ = _local_2a40;
      auVar49._24_8_ = uStack_2a28;
      auVar48._8_8_ = 0xbe2aae50be2aae50;
      auVar48._0_8_ = 0xbe2aae50be2aae50;
      auVar48._16_8_ = 0xbe2aae50be2aae50;
      auVar48._24_8_ = 0xbe2aae50be2aae50;
      auVar4 = vfmadd213ps_fma(auVar49,ZEXT1632(auVar4),auVar48);
      local_2b40 = auVar4._0_8_;
      local_17c0 = local_2b40;
      uStack_2b38 = auVar4._8_8_;
      uStack_17b8 = uStack_2b38;
      uStack_17b0 = 0;
      uStack_17a8 = 0;
      local_17e0 = local_2a40;
      uStack_17d8 = uStack_2a38;
      uStack_17d0 = uStack_2a30;
      uStack_17c8 = uStack_2a28;
      local_1800 = 0x3e4cceac3e4cceac;
      uStack_17f8 = 0x3e4cceac3e4cceac;
      uStack_17f0 = 0x3e4cceac3e4cceac;
      uStack_17e8 = 0x3e4cceac3e4cceac;
      local_11c0 = local_2b40;
      uStack_11b8 = uStack_2b38;
      uStack_11b0 = 0;
      uStack_11a8 = 0;
      local_11e0 = local_2a40;
      uStack_11d8 = uStack_2a38;
      uStack_11d0 = uStack_2a30;
      uStack_11c8 = uStack_2a28;
      local_1200 = 0x3e4cceac3e4cceac;
      uStack_11f8 = 0x3e4cceac3e4cceac;
      uStack_11f0 = 0x3e4cceac3e4cceac;
      uStack_11e8 = 0x3e4cceac3e4cceac;
      auVar51._16_8_ = uStack_2a30;
      auVar51._0_16_ = _local_2a40;
      auVar51._24_8_ = uStack_2a28;
      auVar50._8_8_ = 0x3e4cceac3e4cceac;
      auVar50._0_8_ = 0x3e4cceac3e4cceac;
      auVar50._16_8_ = 0x3e4cceac3e4cceac;
      auVar50._24_8_ = 0x3e4cceac3e4cceac;
      auVar4 = vfmadd213ps_fma(auVar51,ZEXT1632(auVar4),auVar50);
      local_2b40 = auVar4._0_8_;
      local_1820 = local_2b40;
      uStack_2b38 = auVar4._8_8_;
      uStack_1818 = uStack_2b38;
      uStack_1810 = 0;
      uStack_1808 = 0;
      local_1840 = local_2a40;
      uStack_1838 = uStack_2a38;
      uStack_1830 = uStack_2a30;
      uStack_1828 = uStack_2a28;
      local_1860 = 0xbe7ffffcbe7ffffc;
      uStack_1858 = 0xbe7ffffcbe7ffffc;
      uStack_1850 = 0xbe7ffffcbe7ffffc;
      uStack_1848 = 0xbe7ffffcbe7ffffc;
      local_1160 = local_2b40;
      uStack_1158 = uStack_2b38;
      uStack_1150 = 0;
      uStack_1148 = 0;
      local_1180 = local_2a40;
      uStack_1178 = uStack_2a38;
      uStack_1170 = uStack_2a30;
      uStack_1168 = uStack_2a28;
      local_11a0 = 0xbe7ffffcbe7ffffc;
      uStack_1198 = 0xbe7ffffcbe7ffffc;
      uStack_1190 = 0xbe7ffffcbe7ffffc;
      uStack_1188 = 0xbe7ffffcbe7ffffc;
      auVar53._16_8_ = uStack_2a30;
      auVar53._0_16_ = _local_2a40;
      auVar53._24_8_ = uStack_2a28;
      auVar52._8_8_ = 0xbe7ffffcbe7ffffc;
      auVar52._0_8_ = 0xbe7ffffcbe7ffffc;
      auVar52._16_8_ = 0xbe7ffffcbe7ffffc;
      auVar52._24_8_ = 0xbe7ffffcbe7ffffc;
      auVar4 = vfmadd213ps_fma(auVar53,ZEXT1632(auVar4),auVar52);
      local_2b40 = auVar4._0_8_;
      local_1880 = local_2b40;
      uStack_2b38 = auVar4._8_8_;
      uStack_1878 = uStack_2b38;
      uStack_1870 = 0;
      uStack_1868 = 0;
      local_18a0 = local_2a40;
      uStack_1898 = uStack_2a38;
      uStack_1890 = uStack_2a30;
      uStack_1888 = uStack_2a28;
      local_18c0 = 0x3eaaaaaa3eaaaaaa;
      uStack_18b8 = 0x3eaaaaaa3eaaaaaa;
      uStack_18b0 = 0x3eaaaaaa3eaaaaaa;
      uStack_18a8 = 0x3eaaaaaa3eaaaaaa;
      local_1100 = local_2b40;
      uStack_10f8 = uStack_2b38;
      uStack_10f0 = 0;
      uStack_10e8 = 0;
      local_1120 = local_2a40;
      uStack_1118 = uStack_2a38;
      uStack_1110 = uStack_2a30;
      uStack_1108 = uStack_2a28;
      local_1140 = 0x3eaaaaaa3eaaaaaa;
      uStack_1138 = 0x3eaaaaaa3eaaaaaa;
      uStack_1130 = 0x3eaaaaaa3eaaaaaa;
      uStack_1128 = 0x3eaaaaaa3eaaaaaa;
      auVar55._16_8_ = uStack_2a30;
      auVar55._0_16_ = _local_2a40;
      auVar55._24_8_ = uStack_2a28;
      auVar54._8_8_ = 0x3eaaaaaa3eaaaaaa;
      auVar54._0_8_ = 0x3eaaaaaa3eaaaaaa;
      auVar54._16_8_ = 0x3eaaaaaa3eaaaaaa;
      auVar54._24_8_ = 0x3eaaaaaa3eaaaaaa;
      auVar4 = vfmadd213ps_fma(auVar55,ZEXT1632(auVar4),auVar54);
      local_2b40 = auVar4._0_8_;
      uVar19 = local_2b40;
      uStack_2b38 = auVar4._8_8_;
      uVar20 = uStack_2b38;
      uStack_1c70 = 0;
      uStack_1c68 = 0;
      local_1ca0 = local_2a40;
      uStack_1c98 = uStack_2a38;
      uStack_1c90 = uStack_2a30;
      uStack_1c88 = uStack_2a28;
      local_1c80._0_4_ = auVar4._0_4_;
      local_1c80._4_4_ = auVar4._4_4_;
      uStack_1c78._0_4_ = auVar4._8_4_;
      uStack_1c78._4_4_ = auVar4._12_4_;
      local_2b40._4_4_ = local_1c80._4_4_ * (float)local_2a40._4_4_;
      local_2b40._0_4_ = (float)local_1c80 * (float)local_2a40._0_4_;
      uStack_2b38._0_4_ = (float)uStack_1c78 * (float)uStack_28d8;
      uStack_2b38._4_4_ = uStack_1c78._4_4_ * uStack_28d8._4_4_;
      uStack_2b30._0_4_ = (float)uStack_28d0 * 0.0;
      uStack_2b30._4_4_ = uStack_28d0._4_4_ * 0.0;
      auVar123 = _local_2b40;
      local_1cc0 = local_2b40;
      uStack_1cb8 = uStack_2b38;
      uStack_2b30 = auVar123._16_8_;
      uStack_1cb0 = uStack_2b30;
      uStack_2b28 = (ulong)(uint)((float)uStack_28c8 * 0.0);
      uStack_1ca8 = uStack_2b28;
      local_1ce0 = CONCAT44(fStack_2b1c,local_2b20);
      uStack_1cd8 = CONCAT44(fStack_2b14,fStack_2b18);
      uStack_1cd0 = CONCAT44(fStack_2b0c,fStack_2b10);
      uStack_1cc8 = CONCAT44(fStack_2b04,fStack_2b08);
      fVar125 = (float)uStack_28c8 * 0.0 * fStack_2b08;
      local_2b40._4_4_ = local_1c80._4_4_ * (float)local_2a40._4_4_ * fStack_2b1c;
      local_2b40._0_4_ = (float)local_1c80 * (float)local_2a40._0_4_ * local_2b20;
      uStack_2b38._0_4_ = (float)uStack_1c78 * (float)uStack_28d8 * fStack_2b18;
      uStack_2b38._4_4_ = uStack_1c78._4_4_ * uStack_28d8._4_4_ * fStack_2b14;
      uStack_2b30._0_4_ = (float)uStack_28d0 * 0.0 * fStack_2b10;
      uStack_2b30._4_4_ = uStack_28d0._4_4_ * 0.0 * fStack_2b0c;
      auVar123 = _local_2b40;
      local_18e0 = local_2ac0;
      uStack_18d8 = uStack_2ab8;
      uStack_18d0 = uStack_2ab0;
      uStack_18c8 = uStack_2aa8;
      local_1920 = local_2b40;
      uStack_1918 = uStack_2b38;
      uStack_2b30 = auVar123._16_8_;
      uStack_1910 = uStack_2b30;
      uStack_2b28 = (ulong)(uint)fVar125;
      uStack_1908 = uStack_2b28;
      local_10a0 = local_2ac0;
      uStack_1098 = uStack_2ab8;
      uStack_1090 = uStack_2ab0;
      uStack_1088 = uStack_2aa8;
      local_10c0 = 0xb95e8083b95e8083;
      uStack_10b8 = 0xb95e8083b95e8083;
      uStack_10b0 = 0xb95e8083b95e8083;
      uStack_10a8 = 0xb95e8083b95e8083;
      local_10e0 = local_2b40;
      uStack_10d8 = uStack_2b38;
      uStack_10d0 = uStack_2b30;
      uStack_10c8 = uStack_2b28;
      auVar57._8_8_ = 0xb95e8083b95e8083;
      auVar57._0_8_ = 0xb95e8083b95e8083;
      auVar57._16_8_ = 0xb95e8083b95e8083;
      auVar57._24_8_ = 0xb95e8083b95e8083;
      auVar56._16_8_ = uStack_2b30;
      auVar56._0_16_ = _local_2b40;
      auVar56._24_4_ = fVar125;
      auVar56._28_4_ = 0;
      auVar4 = vfmadd213ps_fma(auVar57,_local_2ac0,auVar56);
      local_14c0 = CONCAT44(fStack_2b1c,local_2b20);
      uStack_14b8 = CONCAT44(fStack_2b14,fStack_2b18);
      uStack_14b0 = CONCAT44(fStack_2b0c,fStack_2b10);
      uStack_14a8 = CONCAT44(fStack_2b04,fStack_2b08);
      local_2b40 = auVar4._0_8_;
      local_1500 = local_2b40;
      uStack_2b38 = auVar4._8_8_;
      uStack_14f8 = uStack_2b38;
      uStack_14f0 = 0;
      uStack_14e8 = 0;
      local_d60 = 0x3f0000003f000000;
      uStack_d58 = 0x3f0000003f000000;
      uStack_d50 = 0x3f0000003f000000;
      uStack_d48 = 0x3f0000003f000000;
      local_d80 = local_2b40;
      uStack_d78 = uStack_2b38;
      uStack_d70 = 0;
      uStack_d68 = 0;
      auVar69._8_8_ = uStack_14b8;
      auVar69._0_8_ = local_14c0;
      auVar69._16_8_ = uStack_14b0;
      auVar69._24_8_ = uStack_14a8;
      auVar68._8_8_ = 0x3f0000003f000000;
      auVar68._0_8_ = 0x3f0000003f000000;
      auVar68._16_8_ = 0x3f0000003f000000;
      auVar68._24_8_ = 0x3f0000003f000000;
      auVar4 = vfnmadd213ps_fma(auVar68,auVar69,ZEXT1632(auVar4));
      local_2920 = local_2a40;
      uStack_2918 = uStack_2a38;
      uStack_2910 = uStack_2a30;
      uStack_2908 = uStack_2a28;
      local_2b40 = auVar4._0_8_;
      uVar21 = local_2b40;
      uStack_2b38 = auVar4._8_8_;
      uVar22 = uStack_2b38;
      uStack_2930 = 0;
      uStack_2928 = 0;
      local_2940._0_4_ = auVar4._0_4_;
      local_2940._4_4_ = auVar4._4_4_;
      uStack_2938._0_4_ = auVar4._8_4_;
      uStack_2938._4_4_ = auVar4._12_4_;
      local_2a40._4_4_ = (float)local_2a40._4_4_ + local_2940._4_4_;
      local_2a40._0_4_ = (float)local_2a40._0_4_ + (float)local_2940;
      uStack_2a38._0_4_ = (float)uStack_28d8 + (float)uStack_2938;
      uStack_2a38._4_4_ = uStack_28d8._4_4_ + uStack_2938._4_4_;
      uStack_2a30._0_4_ = (float)uStack_28d0 + 0.0;
      uStack_2a30._4_4_ = uStack_28d0._4_4_ + 0.0;
      auVar123 = _local_2a40;
      uStack_2a28._0_4_ = (float)uStack_28c8 + 0.0;
      uStack_2a28._4_4_ = fStack_2b04 + 0.0;
      auVar1 = _local_2a40;
      local_1940 = local_2ac0;
      uStack_1938 = uStack_2ab8;
      uStack_1930 = uStack_2ab0;
      uStack_1928 = uStack_2aa8;
      local_1980 = local_2a40;
      uStack_1978 = uStack_2a38;
      uStack_2a30 = auVar123._16_8_;
      uStack_1970 = uStack_2a30;
      uStack_2a28 = auVar1._24_8_;
      uStack_1968 = uStack_2a28;
      local_1040 = local_2ac0;
      uStack_1038 = uStack_2ab8;
      uStack_1030 = uStack_2ab0;
      uStack_1028 = uStack_2aa8;
      local_1060 = 0x3f3180003f318000;
      uStack_1058 = 0x3f3180003f318000;
      uStack_1050 = 0x3f3180003f318000;
      uStack_1048 = 0x3f3180003f318000;
      local_1080 = local_2a40;
      uStack_1078 = uStack_2a38;
      uStack_1070 = uStack_2a30;
      uStack_1068 = uStack_2a28;
      auVar59._8_8_ = 0x3f3180003f318000;
      auVar59._0_8_ = 0x3f3180003f318000;
      auVar59._16_8_ = 0x3f3180003f318000;
      auVar59._24_8_ = 0x3f3180003f318000;
      auVar58._16_8_ = uStack_2a30;
      auVar58._0_16_ = _local_2a40;
      auVar58._24_8_ = uStack_2a28;
      auVar4 = vfmadd213ps_fma(auVar59,_local_2ac0,auVar58);
      local_2a40 = auVar4._0_8_;
      local_1ee0 = local_2a40;
      uStack_2a38 = auVar4._8_8_;
      uStack_1ed8 = uStack_2a38;
      uStack_1ed0 = 0;
      uStack_1ec8 = 0;
      local_1f00 = local_2aa0._0_8_;
      uStack_1ef8 = local_2aa0._8_8_;
      uStack_1ef0 = local_2aa0._16_8_;
      uStack_1ee8 = local_2aa0._24_8_;
      _local_2b40 = vorps_avx(ZEXT1632(auVar4),local_2aa0);
      local_2d80 = auVar2._0_8_;
      local_2bc0 = local_2d80;
      uStack_2d78 = auVar2._8_8_;
      uStack_2bb8 = uStack_2d78;
      uStack_2d70 = auVar2._16_8_;
      uStack_2bb0 = uStack_2d70;
      uStack_2d68 = auVar2._24_8_;
      uStack_2ba8 = uStack_2d68;
      auVar1 = vandps_avx(*local_2ca0,auVar2);
      local_2de0 = auVar1._0_8_;
      uStack_2dd8 = auVar1._8_8_;
      uStack_2dd0 = auVar1._16_8_;
      uStack_2dc8 = auVar1._24_8_;
      local_2860._0_4_ = auVar1._0_4_;
      local_2860._4_4_ = auVar1._4_4_;
      uStack_2858._0_4_ = auVar1._8_4_;
      uStack_2858._4_4_ = auVar1._12_4_;
      uStack_2850._0_4_ = auVar1._16_4_;
      uStack_2850._4_4_ = auVar1._20_4_;
      uStack_2848._0_4_ = auVar1._24_4_;
      uStack_2848._4_4_ = auVar1._28_4_;
      local_2880._0_4_ = local_2b40._0_4_;
      local_2880._4_4_ = local_2b40._4_4_;
      uStack_2878._0_4_ = local_2b40._8_4_;
      uStack_2878._4_4_ = local_2b40._12_4_;
      uStack_2870._0_4_ = local_2b40._16_4_;
      uStack_2870._4_4_ = local_2b40._20_4_;
      uStack_2868._0_4_ = local_2b40._24_4_;
      uStack_2868._4_4_ = local_2b40._28_4_;
      local_2528 = local_2ca0;
      local_2560 = CONCAT44(local_2860._4_4_ + local_2880._4_4_,
                            (float)local_2860 + (float)local_2880);
      uStack_2558 = CONCAT44(uStack_2858._4_4_ + uStack_2878._4_4_,
                             (float)uStack_2858 + (float)uStack_2878);
      uStack_2550 = CONCAT44(uStack_2850._4_4_ + uStack_2870._4_4_,
                             (float)uStack_2850 + (float)uStack_2870);
      uStack_2548 = CONCAT44(uStack_2848._4_4_ + uStack_2868._4_4_,
                             (float)uStack_2848 + (float)uStack_2868);
      *(undefined8 *)*local_2ca0 = local_2560;
      *(undefined8 *)(*local_2ca0 + 8) = uStack_2558;
      *(undefined8 *)(*local_2ca0 + 0x10) = uStack_2550;
      *(undefined8 *)(*local_2ca0 + 0x18) = uStack_2548;
      local_2ca0 = local_2ca0 + 1;
      local_2b60 = local_2ba0;
      uStack_2b58 = uStack_2b98;
      uStack_2b50 = uStack_2b90;
      uStack_2b48 = uStack_2b88;
      _local_2a40 = ZEXT1632(auVar4);
      local_2940 = uVar21;
      uStack_2938 = uVar22;
      local_2900 = local_2b00._0_8_;
      uStack_28f8 = local_2b00._8_8_;
      uStack_28f0 = local_2b00._16_8_;
      uStack_28e8 = local_2b00._24_8_;
      local_28e0 = uVar15;
      uStack_28d8 = uVar16;
      uStack_28d0 = uVar17;
      uStack_28c8 = uVar18;
      local_28a0 = uVar11;
      uStack_2898 = uVar12;
      uStack_2890 = uVar13;
      uStack_2888 = uVar14;
      local_2880 = local_2b40;
      uStack_2878 = uStack_2b38;
      uStack_2870 = uStack_2b30;
      uStack_2868 = uStack_2b28;
      local_2860 = local_2de0;
      uStack_2858 = uStack_2dd8;
      uStack_2850 = uStack_2dd0;
      uStack_2848 = uStack_2dc8;
      local_2820 = local_20a0._0_8_;
      uStack_2818 = local_20a0._8_8_;
      uStack_2810 = auStack_2090._0_8_;
      uStack_2808 = auStack_2090._8_8_;
      _local_27e0 = auVar24;
      local_27a0 = local_2a80;
      uStack_2798 = uStack_2a78;
      uStack_2790 = uStack_2a70;
      uStack_2788 = uStack_2a68;
      _local_2740 = auVar33;
      local_2720 = ZEXT1632(auVar8);
      local_2700 = local_2c20;
      local_2680 = uVar9;
      uStack_2678 = uVar10;
      local_2000 = auVar121._0_8_;
      local_1d00 = local_1d20;
      uStack_1cf8 = uStack_1d18;
      uStack_1cf0 = uStack_1d10;
      uStack_1ce8 = uStack_1d08;
      local_1c80 = uVar19;
      uStack_1c78 = uVar20;
      local_1c40 = local_1c60;
      uStack_1c38 = uStack_1c58;
      uStack_1c30 = uStack_1c50;
      uStack_1c28 = uStack_1c48;
      local_1bc0 = local_1ec0;
      uStack_1bb8 = uStack_1eb8;
      uStack_1bb0 = uStack_1eb0;
      uStack_1ba8 = uStack_1ea8;
      local_19e0 = local_1ec0;
      uStack_19d8 = uStack_1eb8;
      uStack_19d0 = uStack_1eb0;
      uStack_19c8 = uStack_1ea8;
      local_15a0 = local_1900;
      uStack_1598 = uStack_18f8;
      uStack_1590 = uStack_18f0;
      uStack_1588 = uStack_18e8;
      local_1540 = local_1960;
      uStack_1538 = uStack_1958;
      uStack_1530 = uStack_1950;
      uStack_1528 = uStack_1948;
      local_14e0 = local_1ec0;
      uStack_14d8 = uStack_1eb8;
      uStack_14d0 = uStack_1eb0;
      uStack_14c8 = uStack_1ea8;
      local_d40 = local_14c0;
      uStack_d38 = uStack_14b8;
      uStack_d30 = uStack_14b0;
      uStack_d28 = uStack_14a8;
      local_c20 = local_2760._0_8_;
      uStack_c18 = local_2760._8_8_;
      uStack_c10 = local_2760._16_8_;
      uStack_c08 = local_2760._24_8_;
      local_b40 = local_1dc0;
      uStack_b38 = uStack_1db8;
      uStack_b30 = uStack_1db0;
      uStack_b28 = uStack_1da8;
    }
    local_2504 = 0x3f800000;
    local_2520 = 0x3f800000;
    uStack_251c = 0x3f800000;
    uStack_2518 = 0x3f800000;
    uStack_2514 = 0x3f800000;
    local_2500._8_8_ = SUB168(ZEXT816(0),4);
    for (; local_2c00 = ZEXT832(0) << 0x20, auVar4 = ZEXT816(0) << 0x20, local_20d0 = local_2c38,
        local_2cc8 = local_2130, local_2cf8 + 3 < local_2c90; local_2cf8 = local_2cf8 + 4) {
      local_24e8 = local_2ca0;
      local_24d0 = *(undefined8 *)*local_2ca0;
      uStack_24c8 = *(undefined8 *)(*local_2ca0 + 8);
      local_24e0 = 0;
      uStack_24d8 = local_2500._8_8_;
      auVar118._8_8_ = 0;
      auVar118._0_8_ = local_2500._8_8_;
      auVar4 = vcmpps_avx(auVar118 << 0x40,*(undefined1 (*) [16])*local_2ca0,1);
      local_24a0[0] = 0x7fffffff;
      local_24a0[1] = 0x7fffffff;
      aiStack_2498[0] = 0x7fffffff;
      aiStack_2498[1] = 0x7fffffff;
      auVar8._8_4_ = 0x7fffffff;
      auVar8._12_4_ = 0x7fffffff;
      auVar8._0_4_ = 0x7fffffff;
      auVar8._4_4_ = 0x7fffffff;
      auVar8 = vpand_avx(*(undefined1 (*) [16])*local_2ca0,auVar8);
      local_2160 = 0;
      uStack_2158 = local_2500._8_8_;
      local_2e30 = auVar8._0_8_;
      local_2170 = local_2e30;
      uStack_2e28 = auVar8._8_8_;
      uStack_2168 = uStack_2e28;
      auVar119._8_8_ = 0;
      auVar119._0_8_ = local_2500._8_8_;
      auVar8 = vsubps_avx(auVar119 << 0x40,auVar8);
      local_2260 = 0;
      uStack_2258 = 0;
      local_2420 = 0x3f8000003f800000;
      uStack_2418 = 0x3f8000003f800000;
      local_2270._0_8_ = auVar8._0_8_;
      local_70 = local_2270._0_8_;
      local_2270._8_8_ = auVar8._8_8_;
      uStack_68 = local_2270._8_8_;
      local_80 = 0x42b0c0a542b0c0a5;
      uStack_78 = 0x42b0c0a542b0c0a5;
      auVar117._8_8_ = 0x42b0c0a542b0c0a5;
      auVar117._0_8_ = 0x42b0c0a542b0c0a5;
      auVar8 = vminps_avx(auVar8,auVar117);
      local_2270._0_8_ = auVar8._0_8_;
      local_920 = local_2270._0_8_;
      local_2270._8_8_ = auVar8._8_8_;
      uStack_918 = local_2270._8_8_;
      local_930 = 0xc2b0c0a5c2b0c0a5;
      uStack_928 = 0xc2b0c0a5c2b0c0a5;
      auVar79._8_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar79._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar5 = vmaxps_avx(auVar8,auVar79);
      local_2270._0_8_ = auVar5._0_8_;
      uVar9 = local_2270._0_8_;
      local_2270._8_8_ = auVar5._8_8_;
      uVar10 = local_2270._8_8_;
      local_820 = 0x3fb8aa3b3fb8aa3b;
      uStack_818 = 0x3fb8aa3b3fb8aa3b;
      local_810._0_4_ = auVar5._0_4_;
      local_810._4_4_ = auVar5._4_4_;
      uStack_808._0_4_ = auVar5._8_4_;
      uStack_808._4_4_ = auVar5._12_4_;
      local_2290._4_4_ = local_810._4_4_ * 1.442695;
      local_2290._0_4_ = (float)local_810 * 1.442695;
      uStack_2288._0_4_ = (float)uStack_808 * 1.442695;
      uStack_2288._4_4_ = uStack_808._4_4_ * 1.442695;
      local_21e0 = local_2290;
      uStack_21d8 = uStack_2288;
      local_21f0 = 0x3f0000003f000000;
      uStack_21e8 = 0x3f0000003f000000;
      local_2290._0_4_ = (float)local_810 * 1.442695 + 0.5;
      local_2290._4_4_ = local_810._4_4_ * 1.442695 + 0.5;
      fVar125 = (float)uStack_808 * 1.442695 + 0.5;
      fVar126 = uStack_808._4_4_ * 1.442695 + 0.5;
      uStack_2288._0_4_ = fVar125;
      uStack_2288._4_4_ = fVar126;
      local_50 = local_2290;
      uStack_48 = uStack_2288;
      local_22a0._4_4_ = (int)(float)local_2290._4_4_;
      local_22a0._0_4_ = (int)(float)local_2290._0_4_;
      local_22a0._8_4_ = (int)fVar125;
      local_22a0._12_4_ = (int)fVar126;
      local_8a0 = local_22a0._0_8_;
      uStack_898 = local_22a0._8_8_;
      auVar83._8_8_ = local_22a0._8_8_;
      auVar83._0_8_ = local_22a0._0_8_;
      auVar3 = vcvtdq2ps_avx(auVar83);
      local_2280 = auVar3._0_8_;
      local_2240 = local_2280;
      uStack_2278 = auVar3._8_8_;
      uStack_2238 = uStack_2278;
      local_2250 = local_2290;
      uStack_2248 = uStack_2288;
      auVar29._8_8_ = uStack_2288;
      auVar29._0_8_ = local_2290;
      auVar8 = vcmpps_avx(auVar29,auVar3,1);
      local_22c0._0_8_ = auVar8._0_8_;
      local_2220 = local_22c0._0_8_;
      local_22c0._8_8_ = auVar8._8_8_;
      uStack_2218 = local_22c0._8_8_;
      local_2230 = 0x3f8000003f800000;
      uStack_2228 = 0x3f8000003f800000;
      auVar30._8_8_ = 0x3f8000003f800000;
      auVar30._0_8_ = 0x3f8000003f800000;
      local_22c0 = vpand_avx(auVar8,auVar30);
      local_21c0 = local_2280;
      uStack_21b8 = uStack_2278;
      local_21d0 = local_22c0._0_8_;
      uStack_21c8 = local_22c0._8_8_;
      _local_2290 = vsubps_avx(auVar3,local_22c0);
      local_450 = local_2290;
      uStack_448 = uStack_2288;
      local_470 = local_2270._0_8_;
      uStack_468 = local_2270._8_8_;
      local_670 = 0x3f3180003f318000;
      uStack_668 = 0x3f3180003f318000;
      local_c0 = local_2290;
      uStack_b8 = uStack_2288;
      local_d0 = 0x3f3180003f318000;
      uStack_c8 = 0x3f3180003f318000;
      local_e0 = local_2270._0_8_;
      uStack_d8 = local_2270._8_8_;
      auVar115._8_8_ = 0x3f3180003f318000;
      auVar115._0_8_ = 0x3f3180003f318000;
      auVar8 = vfnmadd213ps_fma(auVar115,_local_2290,auVar5);
      local_480 = local_2290;
      uStack_478 = uStack_2288;
      local_2270._0_8_ = auVar8._0_8_;
      local_4a0 = local_2270._0_8_;
      local_2270._8_8_ = auVar8._8_8_;
      uStack_498 = local_2270._8_8_;
      local_640 = 0xb95e8083b95e8083;
      uStack_638 = 0xb95e8083b95e8083;
      local_90 = local_2290;
      uStack_88 = uStack_2288;
      local_a0 = 0xb95e8083b95e8083;
      uStack_98 = 0xb95e8083b95e8083;
      local_b0 = local_2270._0_8_;
      uStack_a8 = local_2270._8_8_;
      auVar116._8_8_ = 0xb95e8083b95e8083;
      auVar116._0_8_ = 0xb95e8083b95e8083;
      local_2270 = vfnmadd213ps_fma(auVar116,_local_2290,auVar8);
      local_840 = local_2270._0_8_;
      uStack_838 = local_2270._8_8_;
      local_830._0_4_ = local_2270._0_4_;
      local_830._4_4_ = local_2270._4_4_;
      uStack_828._0_4_ = local_2270._8_4_;
      uStack_828._4_4_ = local_2270._12_4_;
      local_2280 = CONCAT44(local_830._4_4_ * local_830._4_4_,(float)local_830 * (float)local_830);
      uStack_2278._0_4_ = (float)uStack_828 * (float)uStack_828;
      uStack_2278._4_4_ = uStack_828._4_4_ * uStack_828._4_4_;
      local_690 = 0x3950696739506967;
      uStack_688 = 0x3950696739506967;
      local_6a0 = local_2270._0_8_;
      uStack_698 = local_2270._8_8_;
      local_6b0 = 0x3ab743ce3ab743ce;
      uStack_6a8 = 0x3ab743ce3ab743ce;
      local_210 = 0x3950696739506967;
      uStack_208 = 0x3950696739506967;
      local_220 = local_2270._0_8_;
      uStack_218 = local_2270._8_8_;
      local_230 = 0x3ab743ce3ab743ce;
      uStack_228 = 0x3ab743ce3ab743ce;
      auVar107._8_8_ = 0x3950696739506967;
      auVar107._0_8_ = 0x3950696739506967;
      auVar106._8_8_ = 0x3ab743ce3ab743ce;
      auVar106._0_8_ = 0x3ab743ce3ab743ce;
      auVar8 = vfmadd213ps_fma(local_2270,auVar107,auVar106);
      local_22d0 = auVar8._0_8_;
      local_6c0 = local_22d0;
      uStack_22c8 = auVar8._8_8_;
      uStack_6b8 = uStack_22c8;
      local_6d0 = local_2270._0_8_;
      uStack_6c8 = local_2270._8_8_;
      local_6e0 = 0x3c0889083c088908;
      uStack_6d8 = 0x3c0889083c088908;
      local_1e0 = local_22d0;
      uStack_1d8 = uStack_22c8;
      local_1f0 = local_2270._0_8_;
      uStack_1e8 = local_2270._8_8_;
      local_200 = 0x3c0889083c088908;
      uStack_1f8 = 0x3c0889083c088908;
      auVar108._8_8_ = 0x3c0889083c088908;
      auVar108._0_8_ = 0x3c0889083c088908;
      auVar8 = vfmadd213ps_fma(local_2270,auVar8,auVar108);
      local_22d0 = auVar8._0_8_;
      local_6f0 = local_22d0;
      uStack_22c8 = auVar8._8_8_;
      uStack_6e8 = uStack_22c8;
      local_700 = local_2270._0_8_;
      uStack_6f8 = local_2270._8_8_;
      local_710 = 0x3d2aa9c13d2aa9c1;
      uStack_708 = 0x3d2aa9c13d2aa9c1;
      local_1b0 = local_22d0;
      uStack_1a8 = uStack_22c8;
      local_1c0 = local_2270._0_8_;
      uStack_1b8 = local_2270._8_8_;
      local_1d0 = 0x3d2aa9c13d2aa9c1;
      uStack_1c8 = 0x3d2aa9c13d2aa9c1;
      auVar109._8_8_ = 0x3d2aa9c13d2aa9c1;
      auVar109._0_8_ = 0x3d2aa9c13d2aa9c1;
      auVar8 = vfmadd213ps_fma(local_2270,auVar8,auVar109);
      local_22d0 = auVar8._0_8_;
      local_720 = local_22d0;
      uStack_22c8 = auVar8._8_8_;
      uStack_718 = uStack_22c8;
      local_730 = local_2270._0_8_;
      uStack_728 = local_2270._8_8_;
      local_740 = 0x3e2aaaaa3e2aaaaa;
      uStack_738 = 0x3e2aaaaa3e2aaaaa;
      local_180 = local_22d0;
      uStack_178 = uStack_22c8;
      local_190 = local_2270._0_8_;
      uStack_188 = local_2270._8_8_;
      local_1a0 = 0x3e2aaaaa3e2aaaaa;
      uStack_198 = 0x3e2aaaaa3e2aaaaa;
      auVar110._8_8_ = 0x3e2aaaaa3e2aaaaa;
      auVar110._0_8_ = 0x3e2aaaaa3e2aaaaa;
      auVar8 = vfmadd213ps_fma(local_2270,auVar8,auVar110);
      local_22d0 = auVar8._0_8_;
      local_750 = local_22d0;
      uStack_22c8 = auVar8._8_8_;
      uStack_748 = uStack_22c8;
      local_760 = local_2270._0_8_;
      uStack_758 = local_2270._8_8_;
      local_150 = local_22d0;
      uStack_148 = uStack_22c8;
      local_160 = local_2270._0_8_;
      uStack_158 = local_2270._8_8_;
      local_170 = 0x3f0000003f000000;
      uStack_168 = 0x3f0000003f000000;
      auVar111._8_8_ = 0x3f0000003f000000;
      auVar111._0_8_ = 0x3f0000003f000000;
      auVar8 = vfmadd213ps_fma(local_2270,auVar8,auVar111);
      local_22d0 = auVar8._0_8_;
      local_780 = local_22d0;
      uStack_22c8 = auVar8._8_8_;
      uStack_778 = uStack_22c8;
      local_790 = local_2280;
      uStack_788 = uStack_2278;
      local_7a0 = local_2270._0_8_;
      uStack_798 = local_2270._8_8_;
      local_120 = local_22d0;
      uStack_118 = uStack_22c8;
      local_130 = local_2280;
      uStack_128 = uStack_2278;
      local_140 = local_2270._0_8_;
      uStack_138 = local_2270._8_8_;
      auVar112._8_8_ = uStack_2278;
      auVar112._0_8_ = local_2280;
      auVar8 = vfmadd213ps_fma(auVar112,auVar8,local_2270);
      local_22d0 = auVar8._0_8_;
      uVar11 = local_22d0;
      uStack_22c8 = auVar8._8_8_;
      uVar12 = uStack_22c8;
      local_2210 = 0x3f8000003f800000;
      uStack_2208 = 0x3f8000003f800000;
      local_2200._0_4_ = auVar8._0_4_;
      local_2200._4_4_ = auVar8._4_4_;
      uStack_21f8._0_4_ = auVar8._8_4_;
      uStack_21f8._4_4_ = auVar8._12_4_;
      local_22d0 = CONCAT44(local_2200._4_4_ + 1.0,(float)local_2200 + 1.0);
      uStack_22c8._0_4_ = (float)uStack_21f8 + 1.0;
      uStack_22c8._4_4_ = uStack_21f8._4_4_ + 1.0;
      local_60._0_4_ = local_2290._0_4_;
      local_60._4_4_ = local_2290._4_4_;
      uStack_58._0_4_ = local_2290._8_4_;
      uStack_58._4_4_ = local_2290._12_4_;
      local_22a0._4_4_ = (int)local_60._4_4_;
      local_22a0._0_4_ = (int)(float)local_60;
      local_22a0._8_4_ = (int)(float)uStack_58;
      local_22a0._12_4_ = (int)uStack_58._4_4_;
      local_9c0 = local_22a0._0_8_;
      uStack_9b8 = local_22a0._8_8_;
      local_1400 = 0x7f0000007f;
      uStack_13f8 = 0x7f0000007f;
      auVar77._8_8_ = local_22a0._8_8_;
      auVar77._0_8_ = local_22a0._0_8_;
      auVar76._8_8_ = 0x7f0000007f;
      auVar76._0_8_ = 0x7f0000007f;
      auVar8 = vpaddd_avx(auVar76,auVar77);
      local_22a0._0_8_ = auVar8._0_8_;
      local_960 = local_22a0._0_8_;
      local_22a0._8_8_ = auVar8._8_8_;
      uStack_958 = local_22a0._8_8_;
      local_964 = 0x17;
      local_22a0 = vpslld_avx(auVar8,ZEXT416(0x17));
      local_40 = local_22a0._0_8_;
      uStack_38 = local_22a0._8_8_;
      local_22e0 = local_22a0._0_8_;
      uStack_22d8 = local_22a0._8_8_;
      local_850 = local_22d0;
      uStack_848 = uStack_22c8;
      local_860 = local_22a0._0_8_;
      uStack_858 = local_22a0._8_8_;
      fVar125 = local_22a0._0_4_ * ((float)local_2200 + 1.0);
      fVar126 = local_22a0._4_4_ * (local_2200._4_4_ + 1.0);
      fVar127 = local_22a0._8_4_ * ((float)uStack_21f8 + 1.0);
      fVar128 = local_22a0._12_4_ * (uStack_21f8._4_4_ + 1.0);
      local_22d0 = CONCAT44(fVar126,fVar125);
      uStack_22c8._0_4_ = fVar127;
      uStack_22c8._4_4_ = fVar128;
      local_2300 = local_22d0;
      uStack_22f8 = uStack_22c8;
      auVar122._0_8_ = CONCAT44(fVar126 + 1.0,fVar125 + 1.0);
      auVar122._8_4_ = fVar127 + 1.0;
      auVar122._12_4_ = fVar128 + 1.0;
      uStack_23f8 = auVar122._8_8_;
      uStack_938 = uStack_23f8;
      local_23f0 = 0;
      uStack_23e8 = 0;
      local_950 = 0;
      uStack_948 = 0;
      auVar78._8_8_ = uStack_23f8;
      auVar78._0_8_ = auVar122._0_8_;
      local_2430 = vcmpps_avx(auVar78,ZEXT816(0),2);
      uStack_8f8 = uStack_23f8;
      local_910 = 0x80000000800000;
      uStack_908 = 0x80000000800000;
      auVar81._8_8_ = uStack_23f8;
      auVar81._0_8_ = auVar122._0_8_;
      auVar80._8_8_ = 0x80000000800000;
      auVar80._0_8_ = 0x80000000800000;
      auVar8 = vmaxps_avx(auVar81,auVar80);
      local_2400 = auVar8._0_8_;
      local_8f0 = local_2400;
      uStack_23f8 = auVar8._8_8_;
      uStack_8e8 = uStack_23f8;
      local_1450 = local_2400;
      uStack_1448 = uStack_23f8;
      local_1454 = 0x17;
      auVar5 = vpsrld_avx(auVar8,ZEXT416(0x17));
      local_2390 = local_2400;
      uStack_2388 = uStack_23f8;
      local_23a0 = 0x807fffff807fffff;
      uStack_2398 = 0x807fffff807fffff;
      auVar28._8_8_ = 0x807fffff807fffff;
      auVar28._0_8_ = 0x807fffff807fffff;
      auVar8 = vpand_avx(auVar8,auVar28);
      local_2400 = auVar8._0_8_;
      local_8b0 = local_2400;
      uStack_23f8 = auVar8._8_8_;
      uStack_8a8 = uStack_23f8;
      auVar82._8_8_ = 0x3f0000003f000000;
      auVar82._0_8_ = 0x3f0000003f000000;
      auVar3 = vpor_avx(auVar8,auVar82);
      local_2410._0_8_ = auVar5._0_8_;
      local_13f0 = local_2410._0_8_;
      local_2410._8_8_ = auVar5._8_8_;
      uStack_13e8 = local_2410._8_8_;
      auVar38._8_8_ = 0x7f0000007f;
      auVar38._0_8_ = 0x7f0000007f;
      local_2410 = vpsubd_avx(auVar5,auVar38);
      local_890 = local_2410._0_8_;
      uStack_888 = local_2410._8_8_;
      auVar8 = vcvtdq2ps_avx(local_2410);
      local_2440 = auVar8._0_8_;
      uVar13 = local_2440;
      uStack_2438 = auVar8._8_8_;
      uVar14 = uStack_2438;
      local_2340 = 0x3f8000003f800000;
      uStack_2338 = 0x3f8000003f800000;
      local_2330._0_4_ = auVar8._0_4_;
      local_2330._4_4_ = auVar8._4_4_;
      uStack_2328._0_4_ = auVar8._8_4_;
      uStack_2328._4_4_ = auVar8._12_4_;
      local_2440._4_4_ = local_2330._4_4_ + 1.0;
      local_2440._0_4_ = (float)local_2330 + 1.0;
      uStack_2438._0_4_ = (float)uStack_2328 + 1.0;
      uStack_2438._4_4_ = uStack_2328._4_4_ + 1.0;
      local_2400 = auVar3._0_8_;
      local_870 = local_2400;
      uStack_23f8 = auVar3._8_8_;
      uStack_868 = uStack_23f8;
      local_880 = 0x3f3504f33f3504f3;
      uStack_878 = 0x3f3504f33f3504f3;
      auVar84._8_8_ = 0x3f3504f33f3504f3;
      auVar84._0_8_ = 0x3f3504f33f3504f3;
      local_2450 = vcmpps_avx(auVar3,auVar84,1);
      local_23b0 = local_2400;
      uStack_23a8 = uStack_23f8;
      local_23c0 = local_2450._0_8_;
      uStack_23b8 = local_2450._8_8_;
      local_2460 = vpand_avx(auVar3,local_2450);
      local_2180 = local_2400;
      uStack_2178 = uStack_23f8;
      local_2190 = 0x3f8000003f800000;
      uStack_2188 = 0x3f8000003f800000;
      auVar32._8_8_ = 0x3f8000003f800000;
      auVar32._0_8_ = 0x3f8000003f800000;
      auVar8 = vsubps_avx(auVar3,auVar32);
      local_21a0 = local_2440;
      uStack_2198 = uStack_2438;
      local_23d0 = 0x3f8000003f800000;
      uStack_23c8 = 0x3f8000003f800000;
      local_23e0 = local_2450._0_8_;
      uStack_23d8 = local_2450._8_8_;
      auVar27._8_8_ = 0x3f8000003f800000;
      auVar27._0_8_ = 0x3f8000003f800000;
      local_21b0 = vpand_avx(auVar27,local_2450);
      auVar31._8_8_ = uStack_2438;
      auVar31._0_8_ = local_2440;
      _local_2440 = vsubps_avx(auVar31,local_21b0);
      local_2400 = auVar8._0_8_;
      uVar15 = local_2400;
      uStack_23f8 = auVar8._8_8_;
      uVar16 = uStack_23f8;
      local_2350._0_4_ = auVar8._0_4_;
      local_2350._4_4_ = auVar8._4_4_;
      uStack_2348._0_4_ = auVar8._8_4_;
      uStack_2348._4_4_ = auVar8._12_4_;
      local_2360._0_4_ = local_2460._0_4_;
      local_2360._4_4_ = local_2460._4_4_;
      uStack_2358._0_4_ = local_2460._8_4_;
      uStack_2358._4_4_ = local_2460._12_4_;
      local_2400._0_4_ = (float)local_2350 + (float)local_2360;
      local_2400._4_4_ = local_2350._4_4_ + local_2360._4_4_;
      uStack_2348._0_4_ = (float)uStack_2348 + (float)uStack_2358;
      uStack_2348._4_4_ = uStack_2348._4_4_ + uStack_2358._4_4_;
      uStack_23f8._0_4_ = (float)uStack_2348;
      uStack_23f8._4_4_ = uStack_2348._4_4_;
      local_7c0 = local_2400;
      uStack_7b8 = uStack_23f8;
      local_2470 = (float)local_2400._0_4_ * (float)local_2400._0_4_;
      fStack_246c = (float)local_2400._4_4_ * (float)local_2400._4_4_;
      fStack_2468 = (float)uStack_2348 * (float)uStack_2348;
      fStack_2464 = uStack_2348._4_4_ * uStack_2348._4_4_;
      local_4b0 = 0x3d9021bb3d9021bb;
      uStack_4a8 = 0x3d9021bb3d9021bb;
      local_4c0 = local_2400;
      uStack_4b8 = uStack_23f8;
      local_4d0 = 0xbdebd1b8bdebd1b8;
      uStack_4c8 = 0xbdebd1b8bdebd1b8;
      local_3f0 = 0x3d9021bb3d9021bb;
      uStack_3e8 = 0x3d9021bb3d9021bb;
      local_400 = local_2400;
      uStack_3f8 = uStack_23f8;
      local_410 = 0xbdebd1b8bdebd1b8;
      uStack_408 = 0xbdebd1b8bdebd1b8;
      auVar87._8_8_ = 0x3d9021bb3d9021bb;
      auVar87._0_8_ = 0x3d9021bb3d9021bb;
      auVar86._8_8_ = uStack_23f8;
      auVar86._0_8_ = local_2400;
      auVar85._8_8_ = 0xbdebd1b8bdebd1b8;
      auVar85._0_8_ = 0xbdebd1b8bdebd1b8;
      auVar8 = vfmadd213ps_fma(auVar86,auVar87,auVar85);
      local_2480 = auVar8._0_8_;
      local_4e0 = local_2480;
      uStack_2478 = auVar8._8_8_;
      uStack_4d8 = uStack_2478;
      local_4f0 = local_2400;
      uStack_4e8 = uStack_23f8;
      local_500 = 0x3def251a3def251a;
      uStack_4f8 = 0x3def251a3def251a;
      local_3c0 = local_2480;
      uStack_3b8 = uStack_2478;
      local_3d0 = local_2400;
      uStack_3c8 = uStack_23f8;
      local_3e0 = 0x3def251a3def251a;
      uStack_3d8 = 0x3def251a3def251a;
      auVar89._8_8_ = uStack_23f8;
      auVar89._0_8_ = local_2400;
      auVar88._8_8_ = 0x3def251a3def251a;
      auVar88._0_8_ = 0x3def251a3def251a;
      auVar8 = vfmadd213ps_fma(auVar89,auVar8,auVar88);
      local_2480 = auVar8._0_8_;
      local_510 = local_2480;
      uStack_2478 = auVar8._8_8_;
      uStack_508 = uStack_2478;
      local_520 = local_2400;
      uStack_518 = uStack_23f8;
      local_530 = 0xbdfe5d4fbdfe5d4f;
      uStack_528 = 0xbdfe5d4fbdfe5d4f;
      local_390 = local_2480;
      uStack_388 = uStack_2478;
      local_3a0 = local_2400;
      uStack_398 = uStack_23f8;
      local_3b0 = 0xbdfe5d4fbdfe5d4f;
      uStack_3a8 = 0xbdfe5d4fbdfe5d4f;
      auVar91._8_8_ = uStack_23f8;
      auVar91._0_8_ = local_2400;
      auVar90._8_8_ = 0xbdfe5d4fbdfe5d4f;
      auVar90._0_8_ = 0xbdfe5d4fbdfe5d4f;
      auVar8 = vfmadd213ps_fma(auVar91,auVar8,auVar90);
      local_2480 = auVar8._0_8_;
      local_540 = local_2480;
      uStack_2478 = auVar8._8_8_;
      uStack_538 = uStack_2478;
      local_550 = local_2400;
      uStack_548 = uStack_23f8;
      local_560 = 0x3e11e9bf3e11e9bf;
      uStack_558 = 0x3e11e9bf3e11e9bf;
      local_360 = local_2480;
      uStack_358 = uStack_2478;
      local_370 = local_2400;
      uStack_368 = uStack_23f8;
      local_380 = 0x3e11e9bf3e11e9bf;
      uStack_378 = 0x3e11e9bf3e11e9bf;
      auVar93._8_8_ = uStack_23f8;
      auVar93._0_8_ = local_2400;
      auVar92._8_8_ = 0x3e11e9bf3e11e9bf;
      auVar92._0_8_ = 0x3e11e9bf3e11e9bf;
      auVar8 = vfmadd213ps_fma(auVar93,auVar8,auVar92);
      local_2480 = auVar8._0_8_;
      local_570 = local_2480;
      uStack_2478 = auVar8._8_8_;
      uStack_568 = uStack_2478;
      local_580 = local_2400;
      uStack_578 = uStack_23f8;
      local_590 = 0xbe2aae50be2aae50;
      uStack_588 = 0xbe2aae50be2aae50;
      local_330 = local_2480;
      uStack_328 = uStack_2478;
      local_340 = local_2400;
      uStack_338 = uStack_23f8;
      local_350 = 0xbe2aae50be2aae50;
      uStack_348 = 0xbe2aae50be2aae50;
      auVar95._8_8_ = uStack_23f8;
      auVar95._0_8_ = local_2400;
      auVar94._8_8_ = 0xbe2aae50be2aae50;
      auVar94._0_8_ = 0xbe2aae50be2aae50;
      auVar8 = vfmadd213ps_fma(auVar95,auVar8,auVar94);
      local_2480 = auVar8._0_8_;
      local_5a0 = local_2480;
      uStack_2478 = auVar8._8_8_;
      uStack_598 = uStack_2478;
      local_5b0 = local_2400;
      uStack_5a8 = uStack_23f8;
      local_5c0 = 0x3e4cceac3e4cceac;
      uStack_5b8 = 0x3e4cceac3e4cceac;
      local_300 = local_2480;
      uStack_2f8 = uStack_2478;
      local_310 = local_2400;
      uStack_308 = uStack_23f8;
      local_320 = 0x3e4cceac3e4cceac;
      uStack_318 = 0x3e4cceac3e4cceac;
      auVar97._8_8_ = uStack_23f8;
      auVar97._0_8_ = local_2400;
      auVar96._8_8_ = 0x3e4cceac3e4cceac;
      auVar96._0_8_ = 0x3e4cceac3e4cceac;
      auVar8 = vfmadd213ps_fma(auVar97,auVar8,auVar96);
      local_2480 = auVar8._0_8_;
      local_5d0 = local_2480;
      uStack_2478 = auVar8._8_8_;
      uStack_5c8 = uStack_2478;
      local_5e0 = local_2400;
      uStack_5d8 = uStack_23f8;
      local_5f0 = 0xbe7ffffcbe7ffffc;
      uStack_5e8 = 0xbe7ffffcbe7ffffc;
      local_2d0 = local_2480;
      uStack_2c8 = uStack_2478;
      local_2e0 = local_2400;
      uStack_2d8 = uStack_23f8;
      local_2f0 = 0xbe7ffffcbe7ffffc;
      uStack_2e8 = 0xbe7ffffcbe7ffffc;
      auVar99._8_8_ = uStack_23f8;
      auVar99._0_8_ = local_2400;
      auVar98._8_8_ = 0xbe7ffffcbe7ffffc;
      auVar98._0_8_ = 0xbe7ffffcbe7ffffc;
      auVar8 = vfmadd213ps_fma(auVar99,auVar8,auVar98);
      local_2480 = auVar8._0_8_;
      local_600 = local_2480;
      uStack_2478 = auVar8._8_8_;
      uStack_5f8 = uStack_2478;
      local_610 = local_2400;
      uStack_608 = uStack_23f8;
      local_620 = 0x3eaaaaaa3eaaaaaa;
      uStack_618 = 0x3eaaaaaa3eaaaaaa;
      local_2a0 = local_2480;
      uStack_298 = uStack_2478;
      local_2b0 = local_2400;
      uStack_2a8 = uStack_23f8;
      local_2c0 = 0x3eaaaaaa3eaaaaaa;
      uStack_2b8 = 0x3eaaaaaa3eaaaaaa;
      auVar101._8_8_ = uStack_23f8;
      auVar101._0_8_ = local_2400;
      auVar100._8_8_ = 0x3eaaaaaa3eaaaaaa;
      auVar100._0_8_ = 0x3eaaaaaa3eaaaaaa;
      auVar8 = vfmadd213ps_fma(auVar101,auVar8,auVar100);
      local_2480 = auVar8._0_8_;
      uVar17 = local_2480;
      uStack_2478 = auVar8._8_8_;
      uVar18 = uStack_2478;
      local_7e0 = local_2400;
      uStack_7d8 = uStack_23f8;
      local_7d0._0_4_ = auVar8._0_4_;
      local_7d0._4_4_ = auVar8._4_4_;
      uStack_7c8._0_4_ = auVar8._8_4_;
      uStack_7c8._4_4_ = auVar8._12_4_;
      local_2480._4_4_ = local_7d0._4_4_ * (float)local_2400._4_4_;
      local_2480._0_4_ = (float)local_7d0 * (float)local_2400._0_4_;
      uStack_2478._0_4_ = (float)uStack_7c8 * (float)uStack_2348;
      uStack_2478._4_4_ = uStack_7c8._4_4_ * uStack_2348._4_4_;
      local_7f0 = local_2480;
      uStack_7e8 = uStack_2478;
      local_800 = CONCAT44(fStack_246c,local_2470);
      uStack_7f8 = CONCAT44(fStack_2464,fStack_2468);
      local_2480._4_4_ = local_7d0._4_4_ * (float)local_2400._4_4_ * fStack_246c;
      local_2480._0_4_ = (float)local_7d0 * (float)local_2400._0_4_ * local_2470;
      uStack_2478._0_4_ = (float)uStack_7c8 * (float)uStack_2348 * fStack_2468;
      uStack_2478._4_4_ = uStack_7c8._4_4_ * uStack_2348._4_4_ * fStack_2464;
      local_630 = local_2440;
      uStack_628 = uStack_2438;
      local_650 = local_2480;
      uStack_648 = uStack_2478;
      local_270 = local_2440;
      uStack_268 = uStack_2438;
      local_280 = 0xb95e8083b95e8083;
      uStack_278 = 0xb95e8083b95e8083;
      local_290 = local_2480;
      uStack_288 = uStack_2478;
      auVar103._8_8_ = 0xb95e8083b95e8083;
      auVar103._0_8_ = 0xb95e8083b95e8083;
      auVar102._8_8_ = uStack_2478;
      auVar102._0_8_ = local_2480;
      auVar8 = vfmadd213ps_fma(auVar103,_local_2440,auVar102);
      local_420 = CONCAT44(fStack_246c,local_2470);
      uStack_418 = CONCAT44(fStack_2464,fStack_2468);
      local_2480 = auVar8._0_8_;
      local_440 = local_2480;
      uStack_2478 = auVar8._8_8_;
      uStack_438 = uStack_2478;
      local_100 = 0x3f0000003f000000;
      uStack_f8 = 0x3f0000003f000000;
      local_110 = local_2480;
      uStack_108 = uStack_2478;
      auVar114._8_8_ = uStack_418;
      auVar114._0_8_ = local_420;
      auVar113._8_8_ = 0x3f0000003f000000;
      auVar113._0_8_ = 0x3f0000003f000000;
      _local_2480 = vfnmadd213ps_fma(auVar113,auVar114,auVar8);
      local_2370 = local_2400;
      uStack_2368 = uStack_23f8;
      local_2380._0_4_ = local_2480._0_4_;
      local_2380._4_4_ = local_2480._4_4_;
      uStack_2378._0_4_ = local_2480._8_4_;
      uStack_2378._4_4_ = local_2480._12_4_;
      local_2400._4_4_ = (float)local_2400._4_4_ + local_2380._4_4_;
      local_2400._0_4_ = (float)local_2400._0_4_ + (float)local_2380;
      uStack_23f8._0_4_ = (float)uStack_2348 + (float)uStack_2378;
      uStack_23f8._4_4_ = uStack_2348._4_4_ + uStack_2378._4_4_;
      local_660 = local_2440;
      uStack_658 = uStack_2438;
      local_680 = local_2400;
      uStack_678 = uStack_23f8;
      local_240 = local_2440;
      uStack_238 = uStack_2438;
      local_250 = 0x3f3180003f318000;
      uStack_248 = 0x3f3180003f318000;
      local_260 = local_2400;
      uStack_258 = uStack_23f8;
      auVar105._8_8_ = 0x3f3180003f318000;
      auVar105._0_8_ = 0x3f3180003f318000;
      auVar104._8_8_ = uStack_23f8;
      auVar104._0_8_ = local_2400;
      auVar8 = vfmadd213ps_fma(auVar105,_local_2440,auVar104);
      local_2400 = auVar8._0_8_;
      local_8d0 = local_2400;
      uStack_23f8 = auVar8._8_8_;
      uStack_8c8 = uStack_23f8;
      local_8e0 = local_2430._0_8_;
      uStack_8d8 = local_2430._8_8_;
      _local_2400 = vpor_avx(auVar8,local_2430);
      local_2e20 = auVar4._0_8_;
      local_24c0 = local_2e20;
      uStack_2e18 = auVar4._8_8_;
      uStack_24b8 = uStack_2e18;
      auVar4 = vpand_avx(*(undefined1 (*) [16])*local_2ca0,auVar4);
      local_2e50 = auVar4._0_8_;
      uStack_2e48 = auVar4._8_8_;
      local_2310._0_4_ = auVar4._0_4_;
      local_2310._4_4_ = auVar4._4_4_;
      uStack_2308._0_4_ = auVar4._8_4_;
      uStack_2308._4_4_ = auVar4._12_4_;
      local_2320._0_4_ = local_2400._0_4_;
      local_2320._4_4_ = local_2400._4_4_;
      uStack_2318._0_4_ = local_2400._8_4_;
      uStack_2318._4_4_ = local_2400._12_4_;
      local_2e10 = CONCAT44(local_2310._4_4_ + local_2320._4_4_,
                            (float)local_2310 + (float)local_2320);
      uStack_2e08 = CONCAT44(uStack_2308._4_4_ + uStack_2318._4_4_,
                             (float)uStack_2308 + (float)uStack_2318);
      local_2138 = local_2ca0;
      local_2150 = local_2e10;
      uStack_2148 = uStack_2e08;
      *(undefined8 *)*local_2ca0 = local_2e10;
      *(undefined8 *)(*local_2ca0 + 8) = uStack_2e08;
      local_2ca0 = (undefined1 (*) [32])(*local_2ca0 + 0x10);
      local_24b0 = local_24d0;
      uStack_24a8 = uStack_24c8;
      local_2490 = local_24d0;
      uStack_2488 = uStack_24c8;
      local_2380 = local_2480;
      uStack_2378 = uStack_2478;
      local_2360 = local_2460._0_8_;
      uStack_2358 = local_2460._8_8_;
      local_2350 = uVar15;
      uStack_2348 = uVar16;
      local_2330 = uVar13;
      uStack_2328 = uVar14;
      local_2320 = local_2400;
      uStack_2318 = uStack_23f8;
      local_2310 = local_2e50;
      uStack_2308 = uStack_2e48;
      local_22f0 = 0x3f8000003f800000;
      uStack_22e8 = 0x3f8000003f800000;
      local_22b0 = local_2420;
      uStack_22a8 = uStack_2418;
      local_2200 = uVar11;
      uStack_21f8 = uVar12;
      local_9d0 = local_1400;
      uStack_9c8 = uStack_13f8;
      local_940 = auVar122._0_8_;
      local_900 = auVar122._0_8_;
      local_8c0 = local_21f0;
      uStack_8b8 = uStack_21e8;
      local_830 = local_840;
      uStack_828 = uStack_838;
      local_810 = uVar9;
      uStack_808 = uVar10;
      local_7d0 = uVar17;
      uStack_7c8 = uVar18;
      local_7b0 = local_7c0;
      uStack_7a8 = uStack_7b8;
      local_770 = local_21f0;
      uStack_768 = uStack_21e8;
      local_490 = local_640;
      uStack_488 = uStack_638;
      local_460 = local_670;
      uStack_458 = uStack_668;
      local_430 = local_21f0;
      uStack_428 = uStack_21e8;
      local_f0 = local_420;
      uStack_e8 = uStack_418;
      local_60 = local_2290;
      uStack_58 = uStack_2288;
    }
    for (; local_2500 = auVar4, local_2cf8 < local_2c90; local_2cf8 = local_2cf8 + 1) {
      if (*(float *)*local_2ca0 <= 0.0) {
        dVar120 = std::exp((double)(ulong)*(uint *)*local_2ca0);
        dVar120 = std::log((double)(ulong)(uint)(SUB84(dVar120,0) + 1.0));
        *(int *)*local_2ca0 = SUB84(dVar120,0);
      }
      else {
        fVar125 = *(float *)*local_2ca0;
        dVar120 = std::exp((double)(ulong)(*(uint *)*local_2ca0 ^ 0x80000000));
        dVar120 = std::log((double)(ulong)(uint)(SUB84(dVar120,0) + 1.0));
        *(float *)*local_2ca0 = fVar125 + SUB84(dVar120,0);
      }
      local_2ca0 = (undefined1 (*) [32])(*local_2ca0 + 4);
      auVar4 = local_2500;
    }
  }
  return 0;
}

Assistant:

int BNLL_x86_fma::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int d = bottom_top_blob.d;
    int channels = bottom_top_blob.c;
    int elempack = bottom_top_blob.elempack;
    int size = w * h * d * elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);
        int i = 0;

#if __SSE2__
#if __AVX__
#if __AVX512F__
        __m512 _one_avx512 = _mm512_set1_ps(1.f);
        __m512 _zero_avx512 = _mm512_setzero_ps();
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            __mmask16 mask = _mm512_cmp_ps_mask(_p, _zero_avx512, _CMP_GT_OQ);
            __m512 _abs_p = _mm512_castsi512_ps(_mm512_and_epi32(_mm512_castps_si512(_p), _mm512_set1_epi32(0x7fffffff)));
            __m512 _tmp = log512_ps(_mm512_add_ps(_one_avx512, exp512_ps(_mm512_sub_ps(_zero_avx512, _abs_p))));
            _p = _mm512_mask_add_ps(_tmp, mask, _tmp, _p);
            _mm512_storeu_ps(ptr, _p);
            ptr += 16;
        }
#endif // __AVX512F__
        __m256 _one_avx = _mm256_set1_ps(1.f);
        __m256 _zero_avx = _mm256_setzero_ps();
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            __m256 mask = _mm256_cmp_ps(_p, _mm256_setzero_ps(), _CMP_GT_OQ);
            __m256 _abs_p = _mm256_and_ps(_p, *(__m256*)_ps256_inv_sign_mask);
            __m256 _tmp = log256_ps(_mm256_add_ps(_one_avx, exp256_ps(_mm256_sub_ps(_zero_avx, _abs_p))));
            __m256 _x = _mm256_and_ps(_p, mask);
            _p = _mm256_add_ps(_x, _tmp);
            _mm256_storeu_ps(ptr, _p);
            ptr += 8;
        }
#endif // __AVX__
        __m128 _one = _mm_set1_ps(1.f);
        __m128 _zero = _mm_setzero_ps();
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            __m128 mask = _mm_cmpgt_ps(_p, _zero);
            __m128 _abs_p = _mm_and_ps(_p, *(__m128*)_ps_inv_sign_mask);
            __m128 _tmp = log_ps(_mm_add_ps(_one, exp_ps(_mm_sub_ps(_zero, _abs_p))));
            __m128 _x = _mm_and_ps(_p, mask);
            _p = _mm_add_ps(_x, _tmp);
            _mm_store_ps(ptr, _p);
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            if (*ptr > 0)
                *ptr = static_cast<float>(*ptr + log(1.f + exp(-(*ptr))));
            else
                *ptr = static_cast<float>(log(1.f + exp(*ptr)));
            ptr++;
        }
    }
    return 0;
}